

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  byte bVar75;
  ulong uVar76;
  byte bVar77;
  ulong uVar78;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined8 in_R10;
  long lVar79;
  bool bVar80;
  undefined1 uVar81;
  undefined1 uVar82;
  uint uVar83;
  uint uVar147;
  uint uVar148;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  uint uVar149;
  uint uVar153;
  undefined1 auVar144 [32];
  undefined1 auVar92 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float pp;
  float fVar154;
  float fVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar169;
  undefined4 uVar170;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  float fVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar231 [32];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [32];
  undefined1 auVar234 [16];
  undefined1 auVar238 [32];
  undefined1 auVar236 [16];
  undefined1 auVar239 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar248 [64];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [28];
  undefined1 auVar253 [64];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 auVar259 [32];
  float fVar260;
  undefined1 auVar261 [64];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_cc8;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  RTCFilterFunctionNArguments local_af0;
  undefined1 local_ac0 [32];
  undefined1 (*local_a98) [32];
  Primitive *local_a90;
  ulong local_a88;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [64];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  int iVar2;
  int iVar3;
  int iVar4;
  
  uVar78 = (ulong)(byte)prim[1];
  fVar260 = *(float *)(prim + uVar78 * 0x19 + 0x12);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar23 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar91 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar93 = vsubps_avx(auVar86,*(undefined1 (*) [16])(prim + uVar78 * 0x19 + 6));
  fVar211 = fVar260 * auVar93._0_4_;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar78 * 4 + 6);
  auVar103 = vpmovsxbd_avx2(auVar86);
  fVar154 = fVar260 * auVar91._0_4_;
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar78 * 5 + 6);
  auVar101 = vpmovsxbd_avx2(auVar23);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar78 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar78 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar88);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar78 * 0xc + 6);
  auVar106 = vpmovsxbd_avx2(auVar84);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar78 * 0xd + 6);
  auVar102 = vpmovsxbd_avx2(auVar97);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar78 * 0x12 + 6);
  auVar107 = vpmovsxbd_avx2(auVar89);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar78 * 0x13 + 6);
  auVar108 = vpmovsxbd_avx2(auVar85);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar78 * 0x14 + 6);
  auVar110 = vpmovsxbd_avx2(auVar90);
  auVar109 = vcvtdq2ps_avx(auVar110);
  auVar121._8_4_ = 1;
  auVar121._0_8_ = 0x100000001;
  auVar121._12_4_ = 1;
  auVar121._16_4_ = 1;
  auVar121._20_4_ = 1;
  auVar121._24_4_ = 1;
  auVar121._28_4_ = 1;
  auVar119._4_4_ = fVar154;
  auVar119._0_4_ = fVar154;
  auVar119._8_4_ = fVar154;
  auVar119._12_4_ = fVar154;
  auVar119._16_4_ = fVar154;
  auVar119._20_4_ = fVar154;
  auVar119._24_4_ = fVar154;
  auVar119._28_4_ = fVar154;
  auVar100 = ZEXT1632(CONCAT412(fVar260 * auVar91._12_4_,
                                CONCAT48(fVar260 * auVar91._8_4_,
                                         CONCAT44(fVar260 * auVar91._4_4_,fVar154))));
  auVar111 = vpermps_avx2(auVar121,auVar100);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = vpermps_avx512vl(auVar98,auVar100);
  fVar154 = auVar99._0_4_;
  auVar168._0_4_ = fVar154 * auVar104._0_4_;
  fVar181 = auVar99._4_4_;
  auVar168._4_4_ = fVar181 * auVar104._4_4_;
  fVar183 = auVar99._8_4_;
  auVar168._8_4_ = fVar183 * auVar104._8_4_;
  fVar185 = auVar99._12_4_;
  auVar168._12_4_ = fVar185 * auVar104._12_4_;
  fVar155 = auVar99._16_4_;
  auVar168._16_4_ = fVar155 * auVar104._16_4_;
  fVar187 = auVar99._20_4_;
  auVar168._20_4_ = fVar187 * auVar104._20_4_;
  fVar189 = auVar99._24_4_;
  auVar168._28_36_ = in_ZMM4._28_36_;
  auVar168._24_4_ = fVar189 * auVar104._24_4_;
  auVar100._4_4_ = auVar102._4_4_ * fVar181;
  auVar100._0_4_ = auVar102._0_4_ * fVar154;
  auVar100._8_4_ = auVar102._8_4_ * fVar183;
  auVar100._12_4_ = auVar102._12_4_ * fVar185;
  auVar100._16_4_ = auVar102._16_4_ * fVar155;
  auVar100._20_4_ = auVar102._20_4_ * fVar187;
  auVar100._24_4_ = auVar102._24_4_ * fVar189;
  auVar100._28_4_ = auVar110._28_4_;
  auVar110._4_4_ = fVar181 * auVar109._4_4_;
  auVar110._0_4_ = fVar154 * auVar109._0_4_;
  auVar110._8_4_ = fVar183 * auVar109._8_4_;
  auVar110._12_4_ = fVar185 * auVar109._12_4_;
  auVar110._16_4_ = fVar155 * auVar109._16_4_;
  auVar110._20_4_ = fVar187 * auVar109._20_4_;
  auVar110._24_4_ = fVar189 * auVar109._24_4_;
  auVar110._28_4_ = auVar99._28_4_;
  auVar86 = vfmadd231ps_fma(auVar168._0_32_,auVar111,auVar101);
  auVar23 = vfmadd231ps_fma(auVar100,auVar111,auVar106);
  auVar87 = vfmadd231ps_fma(auVar110,auVar108,auVar111);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar119,auVar103);
  auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar119,auVar105);
  auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar107,auVar119);
  auVar120._4_4_ = fVar211;
  auVar120._0_4_ = fVar211;
  auVar120._8_4_ = fVar211;
  auVar120._12_4_ = fVar211;
  auVar120._16_4_ = fVar211;
  auVar120._20_4_ = fVar211;
  auVar120._24_4_ = fVar211;
  auVar120._28_4_ = fVar211;
  auVar111 = ZEXT1632(CONCAT412(fVar260 * auVar93._12_4_,
                                CONCAT48(fVar260 * auVar93._8_4_,
                                         CONCAT44(fVar260 * auVar93._4_4_,fVar211))));
  auVar110 = vpermps_avx2(auVar121,auVar111);
  auVar100 = vpermps_avx512vl(auVar98,auVar111);
  fVar260 = auVar100._0_4_;
  fVar154 = auVar100._4_4_;
  auVar111._4_4_ = fVar154 * auVar104._4_4_;
  auVar111._0_4_ = fVar260 * auVar104._0_4_;
  fVar181 = auVar100._8_4_;
  auVar111._8_4_ = fVar181 * auVar104._8_4_;
  fVar183 = auVar100._12_4_;
  auVar111._12_4_ = fVar183 * auVar104._12_4_;
  fVar185 = auVar100._16_4_;
  auVar111._16_4_ = fVar185 * auVar104._16_4_;
  fVar155 = auVar100._20_4_;
  auVar111._20_4_ = fVar155 * auVar104._20_4_;
  fVar187 = auVar100._24_4_;
  auVar111._24_4_ = fVar187 * auVar104._24_4_;
  auVar111._28_4_ = auVar104._28_4_;
  auVar114._0_4_ = fVar260 * auVar102._0_4_;
  auVar114._4_4_ = fVar154 * auVar102._4_4_;
  auVar114._8_4_ = fVar181 * auVar102._8_4_;
  auVar114._12_4_ = fVar183 * auVar102._12_4_;
  auVar114._16_4_ = fVar185 * auVar102._16_4_;
  auVar114._20_4_ = fVar155 * auVar102._20_4_;
  auVar114._24_4_ = fVar187 * auVar102._24_4_;
  auVar114._28_4_ = 0;
  auVar102._4_4_ = fVar154 * auVar109._4_4_;
  auVar102._0_4_ = fVar260 * auVar109._0_4_;
  auVar102._8_4_ = fVar181 * auVar109._8_4_;
  auVar102._12_4_ = fVar183 * auVar109._12_4_;
  auVar102._16_4_ = fVar185 * auVar109._16_4_;
  auVar102._20_4_ = fVar155 * auVar109._20_4_;
  auVar102._24_4_ = fVar187 * auVar109._24_4_;
  auVar102._28_4_ = auVar109._28_4_;
  auVar88 = vfmadd231ps_fma(auVar111,auVar110,auVar101);
  auVar84 = vfmadd231ps_fma(auVar114,auVar110,auVar106);
  auVar97 = vfmadd231ps_fma(auVar102,auVar110,auVar108);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar120,auVar103);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar120,auVar105);
  auVar97 = vfmadd231ps_fma(ZEXT1632(auVar97),auVar120,auVar107);
  auVar116._8_4_ = 0x7fffffff;
  auVar116._0_8_ = 0x7fffffff7fffffff;
  auVar116._12_4_ = 0x7fffffff;
  auVar116._16_4_ = 0x7fffffff;
  auVar116._20_4_ = 0x7fffffff;
  auVar116._24_4_ = 0x7fffffff;
  auVar116._28_4_ = 0x7fffffff;
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar118._16_4_ = 0x219392ef;
  auVar118._20_4_ = 0x219392ef;
  auVar118._24_4_ = 0x219392ef;
  auVar118._28_4_ = 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar86),auVar116);
  uVar76 = vcmpps_avx512vl(auVar103,auVar118,1);
  bVar80 = (bool)((byte)uVar76 & 1);
  auVar98._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar86._0_4_;
  bVar80 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar98._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar86._4_4_;
  bVar80 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar98._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar86._8_4_;
  bVar80 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar98._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar86._12_4_;
  auVar98._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar98._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar98._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar98._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar23),auVar116);
  uVar76 = vcmpps_avx512vl(auVar103,auVar118,1);
  bVar80 = (bool)((byte)uVar76 & 1);
  auVar99._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar23._0_4_;
  bVar80 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar23._4_4_;
  bVar80 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar23._8_4_;
  bVar80 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar23._12_4_;
  auVar99._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar99._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar99._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar99._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar103 = vandps_avx(ZEXT1632(auVar87),auVar116);
  uVar76 = vcmpps_avx512vl(auVar103,auVar118,1);
  bVar80 = (bool)((byte)uVar76 & 1);
  auVar103._0_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._0_4_;
  bVar80 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._4_4_;
  bVar80 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._8_4_;
  bVar80 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar80 * 0x219392ef | (uint)!bVar80 * auVar87._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar101 = vrcp14ps_avx512vl(auVar98);
  auVar117._8_4_ = 0x3f800000;
  auVar117._0_8_ = 0x3f8000003f800000;
  auVar117._12_4_ = 0x3f800000;
  auVar117._16_4_ = 0x3f800000;
  auVar117._20_4_ = 0x3f800000;
  auVar117._24_4_ = 0x3f800000;
  auVar117._28_4_ = 0x3f800000;
  auVar86 = vfnmadd213ps_fma(auVar98,auVar101,auVar117);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar99);
  auVar23 = vfnmadd213ps_fma(auVar99,auVar101,auVar117);
  auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar101,auVar101);
  auVar101 = vrcp14ps_avx512vl(auVar103);
  auVar87 = vfnmadd213ps_fma(auVar103,auVar101,auVar117);
  auVar87 = vfmadd132ps_fma(ZEXT1632(auVar87),auVar101,auVar101);
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 7 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar88));
  auVar107._4_4_ = auVar86._4_4_ * auVar103._4_4_;
  auVar107._0_4_ = auVar86._0_4_ * auVar103._0_4_;
  auVar107._8_4_ = auVar86._8_4_ * auVar103._8_4_;
  auVar107._12_4_ = auVar86._12_4_ * auVar103._12_4_;
  auVar107._16_4_ = auVar103._16_4_ * 0.0;
  auVar107._20_4_ = auVar103._20_4_ * 0.0;
  auVar107._24_4_ = auVar103._24_4_ * 0.0;
  auVar107._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 9 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar88));
  auVar115._0_4_ = auVar86._0_4_ * auVar103._0_4_;
  auVar115._4_4_ = auVar86._4_4_ * auVar103._4_4_;
  auVar115._8_4_ = auVar86._8_4_ * auVar103._8_4_;
  auVar115._12_4_ = auVar86._12_4_ * auVar103._12_4_;
  auVar115._16_4_ = auVar103._16_4_ * 0.0;
  auVar115._20_4_ = auVar103._20_4_ * 0.0;
  auVar115._24_4_ = auVar103._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0xe + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar84));
  auVar108._4_4_ = auVar23._4_4_ * auVar103._4_4_;
  auVar108._0_4_ = auVar23._0_4_ * auVar103._0_4_;
  auVar108._8_4_ = auVar23._8_4_ * auVar103._8_4_;
  auVar108._12_4_ = auVar23._12_4_ * auVar103._12_4_;
  auVar108._16_4_ = auVar103._16_4_ * 0.0;
  auVar108._20_4_ = auVar103._20_4_ * 0.0;
  auVar108._24_4_ = auVar103._24_4_ * 0.0;
  auVar108._28_4_ = auVar103._28_4_;
  auVar102 = vpbroadcastd_avx512vl();
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar84));
  auVar101 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x15 + 6));
  auVar113._0_4_ = auVar23._0_4_ * auVar103._0_4_;
  auVar113._4_4_ = auVar23._4_4_ * auVar103._4_4_;
  auVar113._8_4_ = auVar23._8_4_ * auVar103._8_4_;
  auVar113._12_4_ = auVar23._12_4_ * auVar103._12_4_;
  auVar113._16_4_ = auVar103._16_4_ * 0.0;
  auVar113._20_4_ = auVar103._20_4_ * 0.0;
  auVar113._24_4_ = auVar103._24_4_ * 0.0;
  auVar113._28_4_ = 0;
  auVar103 = vcvtdq2ps_avx(auVar101);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar97));
  auVar109._4_4_ = auVar103._4_4_ * auVar87._4_4_;
  auVar109._0_4_ = auVar103._0_4_ * auVar87._0_4_;
  auVar109._8_4_ = auVar103._8_4_ * auVar87._8_4_;
  auVar109._12_4_ = auVar103._12_4_ * auVar87._12_4_;
  auVar109._16_4_ = auVar103._16_4_ * 0.0;
  auVar109._20_4_ = auVar103._20_4_ * 0.0;
  auVar109._24_4_ = auVar103._24_4_ * 0.0;
  auVar109._28_4_ = auVar103._28_4_;
  auVar103 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar78 * 0x17 + 6));
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar103 = vsubps_avx(auVar103,ZEXT1632(auVar97));
  auVar112._0_4_ = auVar87._0_4_ * auVar103._0_4_;
  auVar112._4_4_ = auVar87._4_4_ * auVar103._4_4_;
  auVar112._8_4_ = auVar87._8_4_ * auVar103._8_4_;
  auVar112._12_4_ = auVar87._12_4_ * auVar103._12_4_;
  auVar112._16_4_ = auVar103._16_4_ * 0.0;
  auVar112._20_4_ = auVar103._20_4_ * 0.0;
  auVar112._24_4_ = auVar103._24_4_ * 0.0;
  auVar112._28_4_ = 0;
  auVar103 = vpminsd_avx2(auVar107,auVar115);
  auVar101 = vpminsd_avx2(auVar108,auVar113);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101 = vpminsd_avx2(auVar109,auVar112);
  uVar170 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar104._4_4_ = uVar170;
  auVar104._0_4_ = uVar170;
  auVar104._8_4_ = uVar170;
  auVar104._12_4_ = uVar170;
  auVar104._16_4_ = uVar170;
  auVar104._20_4_ = uVar170;
  auVar104._24_4_ = uVar170;
  auVar104._28_4_ = uVar170;
  auVar101 = vmaxps_avx512vl(auVar101,auVar104);
  auVar103 = vmaxps_avx(auVar103,auVar101);
  auVar101._8_4_ = 0x3f7ffffa;
  auVar101._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar101._12_4_ = 0x3f7ffffa;
  auVar101._16_4_ = 0x3f7ffffa;
  auVar101._20_4_ = 0x3f7ffffa;
  auVar101._24_4_ = 0x3f7ffffa;
  auVar101._28_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar103,auVar101);
  auVar103 = vpmaxsd_avx2(auVar107,auVar115);
  auVar101 = vpmaxsd_avx2(auVar108,auVar113);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar101 = vpmaxsd_avx2(auVar109,auVar112);
  uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar105._4_4_ = uVar170;
  auVar105._0_4_ = uVar170;
  auVar105._8_4_ = uVar170;
  auVar105._12_4_ = uVar170;
  auVar105._16_4_ = uVar170;
  auVar105._20_4_ = uVar170;
  auVar105._24_4_ = uVar170;
  auVar105._28_4_ = uVar170;
  auVar101 = vminps_avx512vl(auVar101,auVar105);
  auVar103 = vminps_avx(auVar103,auVar101);
  auVar106._8_4_ = 0x3f800003;
  auVar106._0_8_ = 0x3f8000033f800003;
  auVar106._12_4_ = 0x3f800003;
  auVar106._16_4_ = 0x3f800003;
  auVar106._20_4_ = 0x3f800003;
  auVar106._24_4_ = 0x3f800003;
  auVar106._28_4_ = 0x3f800003;
  auVar103 = vmulps_avx512vl(auVar103,auVar106);
  uVar24 = vcmpps_avx512vl(local_5a0,auVar103,2);
  uVar27 = vpcmpgtd_avx512vl(auVar102,_DAT_01fb4ba0);
  local_a88 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar24 & (byte)uVar27));
  local_a98 = (undefined1 (*) [32])local_240;
  auVar168 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar168);
  local_a90 = prim;
LAB_01a7e5a6:
  if (local_a88 == 0) {
    return;
  }
  lVar79 = 0;
  for (uVar76 = local_a88; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    lVar79 = lVar79 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  uVar6 = *(uint *)(prim + lVar79 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  uVar76 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar6);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar79 = *(long *)&pGVar7[1].time_range.upper;
  auVar86 = *(undefined1 (*) [16])(lVar79 + (long)p_Var8 * uVar76);
  auVar23 = *(undefined1 (*) [16])(lVar79 + (uVar76 + 1) * (long)p_Var8);
  auVar87 = *(undefined1 (*) [16])(lVar79 + (uVar76 + 2) * (long)p_Var8);
  local_a88 = local_a88 - 1 & local_a88;
  auVar88 = *(undefined1 (*) [16])(lVar79 + (uVar76 + 3) * (long)p_Var8);
  if (local_a88 != 0) {
    uVar78 = local_a88 - 1 & local_a88;
    for (uVar76 = local_a88; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
    }
    if (uVar78 != 0) {
      for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar84 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar97 = vinsertps_avx(auVar84,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_720 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar84 = vunpcklps_avx512vl(local_700._0_16_,local_720._0_16_);
  _local_740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar90 = local_740._0_16_;
  local_990 = vinsertps_avx512f(auVar84,auVar90,0x28);
  auVar93._0_4_ = auVar86._0_4_ + auVar23._0_4_ + auVar87._0_4_ + auVar88._0_4_;
  auVar93._4_4_ = auVar86._4_4_ + auVar23._4_4_ + auVar87._4_4_ + auVar88._4_4_;
  auVar93._8_4_ = auVar86._8_4_ + auVar23._8_4_ + auVar87._8_4_ + auVar88._8_4_;
  auVar93._12_4_ = auVar86._12_4_ + auVar23._12_4_ + auVar87._12_4_ + auVar88._12_4_;
  auVar91._8_4_ = 0x3e800000;
  auVar91._0_8_ = 0x3e8000003e800000;
  auVar91._12_4_ = 0x3e800000;
  auVar84 = vmulps_avx512vl(auVar93,auVar91);
  auVar84 = vsubps_avx(auVar84,auVar97);
  auVar84 = vdpps_avx(auVar84,local_990,0x7f);
  local_9a0 = vdpps_avx(local_990,local_990,0x7f);
  fVar260 = *(float *)(ray + k * 4 + 0xc0);
  auVar94._4_12_ = ZEXT812(0) << 0x20;
  auVar94._0_4_ = local_9a0._0_4_;
  auVar85 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar94);
  auVar89 = vfnmadd213ss_fma(auVar85,local_9a0,ZEXT416(0x40000000));
  local_580 = auVar84._0_4_ * auVar85._0_4_ * auVar89._0_4_;
  auVar92._4_4_ = local_580;
  auVar92._0_4_ = local_580;
  auVar92._8_4_ = local_580;
  auVar92._12_4_ = local_580;
  fStack_950 = local_580;
  _local_960 = auVar92;
  fStack_94c = local_580;
  fStack_948 = local_580;
  fStack_944 = local_580;
  auVar84 = vfmadd231ps_fma(auVar97,local_990,auVar92);
  auVar84 = vblendps_avx(auVar84,ZEXT816(0) << 0x40,8);
  auVar86 = vsubps_avx(auVar86,auVar84);
  auVar87 = vsubps_avx(auVar87,auVar84);
  auVar23 = vsubps_avx(auVar23,auVar84);
  auVar88 = vsubps_avx(auVar88,auVar84);
  uVar170 = auVar86._0_4_;
  local_a20._4_4_ = uVar170;
  local_a20._0_4_ = uVar170;
  local_a20._8_4_ = uVar170;
  local_a20._12_4_ = uVar170;
  local_a20._16_4_ = uVar170;
  local_a20._20_4_ = uVar170;
  local_a20._24_4_ = uVar170;
  local_a20._28_4_ = uVar170;
  auVar251 = ZEXT3264(local_a20);
  auVar123._8_4_ = 1;
  auVar123._0_8_ = 0x100000001;
  auVar123._12_4_ = 1;
  auVar123._16_4_ = 1;
  auVar123._20_4_ = 1;
  auVar123._24_4_ = 1;
  auVar123._28_4_ = 1;
  local_800 = ZEXT1632(auVar86);
  local_a40 = vpermps_avx2(auVar123,local_800);
  auVar256 = ZEXT3264(local_a40);
  auVar124._8_4_ = 2;
  auVar124._0_8_ = 0x200000002;
  auVar124._12_4_ = 2;
  auVar124._16_4_ = 2;
  auVar124._20_4_ = 2;
  auVar124._24_4_ = 2;
  auVar124._28_4_ = 2;
  local_a60 = vpermps_avx2(auVar124,local_800);
  auVar258 = ZEXT3264(local_a60);
  auVar125._8_4_ = 3;
  auVar125._0_8_ = 0x300000003;
  auVar125._12_4_ = 3;
  auVar125._16_4_ = 3;
  auVar125._20_4_ = 3;
  auVar125._24_4_ = 3;
  auVar125._28_4_ = 3;
  local_9c0 = vpermps_avx2(auVar125,local_800);
  uVar170 = auVar23._0_4_;
  local_9e0._4_4_ = uVar170;
  local_9e0._0_4_ = uVar170;
  local_9e0._8_4_ = uVar170;
  local_9e0._12_4_ = uVar170;
  local_9e0._16_4_ = uVar170;
  local_9e0._20_4_ = uVar170;
  local_9e0._24_4_ = uVar170;
  local_9e0._28_4_ = uVar170;
  auVar243 = ZEXT3264(local_9e0);
  local_840 = ZEXT1632(auVar23);
  local_a00 = vpermps_avx2(auVar123,local_840);
  local_a80 = vpermps_avx2(auVar124,local_840);
  auVar261 = ZEXT3264(local_a80);
  auVar103 = vpermps_avx512vl(auVar125,local_840);
  auVar250 = ZEXT3264(local_a00);
  auVar101 = vbroadcastss_avx512vl(auVar87);
  local_820 = ZEXT1632(auVar87);
  auVar104 = vpermps_avx512vl(auVar123,local_820);
  auVar105 = vpermps_avx512vl(auVar124,local_820);
  auVar106 = vpermps_avx512vl(auVar125,local_820);
  auVar248 = ZEXT3264(local_9c0);
  auVar102 = vbroadcastss_avx512vl(auVar88);
  _local_860 = ZEXT1632(auVar88);
  auVar107 = vpermps_avx512vl(auVar123,_local_860);
  auVar108 = vpermps_avx512vl(auVar124,_local_860);
  auVar109 = vpermps_avx512vl(auVar125,_local_860);
  auVar86 = vmulss_avx512f(auVar90,auVar90);
  auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),local_720,local_720);
  auVar110 = vfmadd231ps_avx512vl(auVar110,local_700,local_700);
  auVar110 = vbroadcastss_avx512vl(auVar110._0_16_);
  auVar122._8_4_ = 0x7fffffff;
  auVar122._0_8_ = 0x7fffffff7fffffff;
  auVar122._12_4_ = 0x7fffffff;
  auVar122._16_4_ = 0x7fffffff;
  auVar122._20_4_ = 0x7fffffff;
  auVar122._24_4_ = 0x7fffffff;
  auVar122._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar110,auVar122);
  local_560 = auVar110;
  local_920 = ZEXT416((uint)local_580);
  local_580 = fVar260 - local_580;
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  auVar168 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar168);
  uVar76 = 0;
  local_cc8 = 1;
  auVar168 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar168);
  auVar86 = vsqrtss_avx(local_9a0,local_9a0);
  auVar23 = vsqrtss_avx(local_9a0,local_9a0);
  auVar253 = ZEXT3264(local_a80);
  local_630 = ZEXT816(0x3f80000000000000);
  auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar263 = ZEXT3264(auVar111);
  auVar168 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar87 = vmovshdup_avx(local_630);
    auVar87 = vsubps_avx(auVar87,local_630);
    fVar187 = auVar87._0_4_;
    fVar155 = fVar187 * 0.04761905;
    auVar206._0_4_ = local_630._0_4_;
    auVar206._4_4_ = auVar206._0_4_;
    auVar206._8_4_ = auVar206._0_4_;
    auVar206._12_4_ = auVar206._0_4_;
    auVar206._16_4_ = auVar206._0_4_;
    auVar206._20_4_ = auVar206._0_4_;
    auVar206._24_4_ = auVar206._0_4_;
    auVar206._28_4_ = auVar206._0_4_;
    auVar225._4_4_ = fVar187;
    auVar225._0_4_ = fVar187;
    auVar225._8_4_ = fVar187;
    auVar225._12_4_ = fVar187;
    auVar225._16_4_ = fVar187;
    auVar225._20_4_ = fVar187;
    auVar225._24_4_ = fVar187;
    auVar225._28_4_ = fVar187;
    auVar87 = vfmadd231ps_fma(auVar206,auVar225,auVar168._0_32_);
    auVar262 = auVar263._0_32_;
    auVar111 = vsubps_avx512vl(auVar262,ZEXT1632(auVar87));
    fVar154 = auVar87._0_4_;
    fVar181 = auVar87._4_4_;
    auVar231._4_4_ = auVar243._4_4_ * fVar181;
    auVar231._0_4_ = auVar243._0_4_ * fVar154;
    fVar183 = auVar87._8_4_;
    auVar231._8_4_ = auVar243._8_4_ * fVar183;
    fVar185 = auVar87._12_4_;
    auVar231._12_4_ = auVar243._12_4_ * fVar185;
    auVar231._16_4_ = auVar243._16_4_ * 0.0;
    auVar231._20_4_ = auVar243._20_4_ * 0.0;
    auVar231._24_4_ = auVar243._24_4_ * 0.0;
    auVar231._28_4_ = auVar206._0_4_;
    auVar131._4_4_ = auVar250._4_4_ * fVar181;
    auVar131._0_4_ = auVar250._0_4_ * fVar154;
    auVar131._8_4_ = auVar250._8_4_ * fVar183;
    auVar131._12_4_ = auVar250._12_4_ * fVar185;
    auVar131._16_4_ = auVar250._16_4_ * 0.0;
    auVar131._20_4_ = auVar250._20_4_ * 0.0;
    auVar131._24_4_ = auVar250._24_4_ * 0.0;
    auVar131._28_4_ = fVar187;
    auVar232._0_4_ = auVar253._0_4_ * fVar154;
    auVar232._4_4_ = auVar253._4_4_ * fVar181;
    auVar232._8_4_ = auVar253._8_4_ * fVar183;
    auVar232._12_4_ = auVar253._12_4_ * fVar185;
    auVar232._16_4_ = auVar253._16_4_ * 0.0;
    auVar232._20_4_ = auVar253._20_4_ * 0.0;
    auVar232._28_36_ = auVar168._28_36_;
    auVar232._24_4_ = auVar253._24_4_ * 0.0;
    auVar100 = vmulps_avx512vl(auVar103,ZEXT1632(auVar87));
    auVar88 = vfmadd231ps_fma(auVar231,auVar111,auVar251._0_32_);
    auVar84 = vfmadd231ps_fma(auVar131,auVar111,auVar256._0_32_);
    auVar97 = vfmadd231ps_fma(auVar232._0_32_,auVar111,auVar258._0_32_);
    auVar89 = vfmadd231ps_fma(auVar100,auVar111,auVar248._0_32_);
    auVar100 = vmulps_avx512vl(auVar101,ZEXT1632(auVar87));
    auVar114 = ZEXT1632(auVar87);
    auVar98 = vmulps_avx512vl(auVar104,auVar114);
    auVar99 = vmulps_avx512vl(auVar105,auVar114);
    auVar112 = vmulps_avx512vl(auVar106,auVar114);
    auVar85 = vfmadd231ps_fma(auVar100,auVar111,auVar243._0_32_);
    auVar90 = vfmadd231ps_fma(auVar98,auVar111,auVar250._0_32_);
    auVar91 = vfmadd231ps_fma(auVar99,auVar111,auVar253._0_32_);
    auVar100 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar103);
    auVar98 = vmulps_avx512vl(auVar102,auVar114);
    auVar99 = vmulps_avx512vl(auVar107,auVar114);
    auVar112 = vmulps_avx512vl(auVar108,auVar114);
    auVar113 = vmulps_avx512vl(auVar109,auVar114);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar111,auVar101);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar111,auVar104);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar105);
    auVar113 = vfmadd231ps_avx512vl(auVar113,auVar111,auVar106);
    auVar243._28_36_ = auVar261._28_36_;
    auVar243._0_28_ =
         ZEXT1628(CONCAT412(fVar185 * auVar85._12_4_,
                            CONCAT48(fVar183 * auVar85._8_4_,
                                     CONCAT44(fVar181 * auVar85._4_4_,fVar154 * auVar85._0_4_))));
    auVar114 = vmulps_avx512vl(auVar114,ZEXT1632(auVar90));
    auVar115 = vmulps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar91));
    auVar116 = vmulps_avx512vl(ZEXT1632(auVar87),auVar100);
    auVar87 = vfmadd231ps_fma(auVar243._0_32_,auVar111,ZEXT1632(auVar88));
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,ZEXT1632(auVar84));
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar111,ZEXT1632(auVar97));
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar111,ZEXT1632(auVar89));
    auVar242._0_4_ = auVar98._0_4_ * fVar154;
    auVar242._4_4_ = auVar98._4_4_ * fVar181;
    auVar242._8_4_ = auVar98._8_4_ * fVar183;
    auVar242._12_4_ = auVar98._12_4_ * fVar185;
    auVar242._16_4_ = auVar98._16_4_ * 0.0;
    auVar242._20_4_ = auVar98._20_4_ * 0.0;
    auVar242._24_4_ = auVar98._24_4_ * 0.0;
    auVar242._28_4_ = 0;
    auVar132._4_4_ = auVar99._4_4_ * fVar181;
    auVar132._0_4_ = auVar99._0_4_ * fVar154;
    auVar132._8_4_ = auVar99._8_4_ * fVar183;
    auVar132._12_4_ = auVar99._12_4_ * fVar185;
    auVar132._16_4_ = auVar99._16_4_ * 0.0;
    auVar132._20_4_ = auVar99._20_4_ * 0.0;
    auVar132._24_4_ = auVar99._24_4_ * 0.0;
    auVar132._28_4_ = auVar98._28_4_;
    auVar133._4_4_ = auVar112._4_4_ * fVar181;
    auVar133._0_4_ = auVar112._0_4_ * fVar154;
    auVar133._8_4_ = auVar112._8_4_ * fVar183;
    auVar133._12_4_ = auVar112._12_4_ * fVar185;
    auVar133._16_4_ = auVar112._16_4_ * 0.0;
    auVar133._20_4_ = auVar112._20_4_ * 0.0;
    auVar133._24_4_ = auVar112._24_4_ * 0.0;
    auVar133._28_4_ = auVar99._28_4_;
    auVar136._4_4_ = auVar113._4_4_ * fVar181;
    auVar136._0_4_ = auVar113._0_4_ * fVar154;
    auVar136._8_4_ = auVar113._8_4_ * fVar183;
    auVar136._12_4_ = auVar113._12_4_ * fVar185;
    auVar136._16_4_ = auVar113._16_4_ * 0.0;
    auVar136._20_4_ = auVar113._20_4_ * 0.0;
    auVar136._24_4_ = auVar113._24_4_ * 0.0;
    auVar136._28_4_ = auVar112._28_4_;
    auVar88 = vfmadd231ps_fma(auVar242,auVar111,ZEXT1632(auVar85));
    auVar84 = vfmadd231ps_fma(auVar132,auVar111,ZEXT1632(auVar90));
    auVar97 = vfmadd231ps_fma(auVar133,auVar111,ZEXT1632(auVar91));
    auVar89 = vfmadd231ps_fma(auVar136,auVar111,auVar100);
    auVar85 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar185 * auVar88._12_4_,
                                                 CONCAT48(fVar183 * auVar88._8_4_,
                                                          CONCAT44(fVar181 * auVar88._4_4_,
                                                                   fVar154 * auVar88._0_4_)))),
                              auVar111,ZEXT1632(auVar87));
    auVar117 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar84._12_4_ * fVar185,
                                             CONCAT48(auVar84._8_4_ * fVar183,
                                                      CONCAT44(auVar84._4_4_ * fVar181,
                                                               auVar84._0_4_ * fVar154)))),auVar111,
                          auVar114);
    auVar118 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar97._12_4_ * fVar185,
                                             CONCAT48(auVar97._8_4_ * fVar183,
                                                      CONCAT44(auVar97._4_4_ * fVar181,
                                                               auVar97._0_4_ * fVar154)))),auVar111,
                          auVar115);
    auVar100 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar89._12_4_ * fVar185,
                                             CONCAT48(auVar89._8_4_ * fVar183,
                                                      CONCAT44(auVar89._4_4_ * fVar181,
                                                               auVar89._0_4_ * fVar154)))),auVar116,
                          auVar111);
    auVar111 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar87));
    auVar98 = vsubps_avx512vl(ZEXT1632(auVar84),auVar114);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar97),auVar115);
    auVar112 = vsubps_avx512vl(ZEXT1632(auVar89),auVar116);
    auVar254._0_4_ = fVar155 * auVar111._0_4_ * 3.0;
    auVar254._4_4_ = fVar155 * auVar111._4_4_ * 3.0;
    auVar254._8_4_ = fVar155 * auVar111._8_4_ * 3.0;
    auVar254._12_4_ = fVar155 * auVar111._12_4_ * 3.0;
    auVar254._16_4_ = fVar155 * auVar111._16_4_ * 3.0;
    auVar254._20_4_ = fVar155 * auVar111._20_4_ * 3.0;
    auVar254._24_4_ = fVar155 * auVar111._24_4_ * 3.0;
    auVar254._28_4_ = 0;
    auVar257._0_4_ = fVar155 * auVar98._0_4_ * 3.0;
    auVar257._4_4_ = fVar155 * auVar98._4_4_ * 3.0;
    auVar257._8_4_ = fVar155 * auVar98._8_4_ * 3.0;
    auVar257._12_4_ = fVar155 * auVar98._12_4_ * 3.0;
    auVar257._16_4_ = fVar155 * auVar98._16_4_ * 3.0;
    auVar257._20_4_ = fVar155 * auVar98._20_4_ * 3.0;
    auVar257._24_4_ = fVar155 * auVar98._24_4_ * 3.0;
    auVar257._28_4_ = 0;
    auVar137._4_4_ = fVar155 * auVar99._4_4_ * 3.0;
    auVar137._0_4_ = fVar155 * auVar99._0_4_ * 3.0;
    auVar137._8_4_ = fVar155 * auVar99._8_4_ * 3.0;
    auVar137._12_4_ = fVar155 * auVar99._12_4_ * 3.0;
    auVar137._16_4_ = fVar155 * auVar99._16_4_ * 3.0;
    auVar137._20_4_ = fVar155 * auVar99._20_4_ * 3.0;
    auVar137._24_4_ = fVar155 * auVar99._24_4_ * 3.0;
    auVar137._28_4_ = auVar113._28_4_;
    fVar154 = auVar112._0_4_ * 3.0 * fVar155;
    fVar181 = auVar112._4_4_ * 3.0 * fVar155;
    auVar44._4_4_ = fVar181;
    auVar44._0_4_ = fVar154;
    fVar183 = auVar112._8_4_ * 3.0 * fVar155;
    auVar44._8_4_ = fVar183;
    fVar185 = auVar112._12_4_ * 3.0 * fVar155;
    auVar44._12_4_ = fVar185;
    fVar187 = auVar112._16_4_ * 3.0 * fVar155;
    auVar44._16_4_ = fVar187;
    fVar189 = auVar112._20_4_ * 3.0 * fVar155;
    auVar44._20_4_ = fVar189;
    fVar211 = auVar112._24_4_ * 3.0 * fVar155;
    auVar44._24_4_ = fVar211;
    auVar44._28_4_ = fVar155;
    auVar87 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar87);
    auVar113 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_01fb9fc0,ZEXT1632(auVar87));
    auVar114 = vpermt2ps_avx512vl(auVar117,_DAT_01fb9fc0,ZEXT1632(auVar87));
    auVar98 = ZEXT1632(auVar87);
    auVar115 = vpermt2ps_avx512vl(auVar118,_DAT_01fb9fc0,auVar98);
    auVar237._0_4_ = auVar100._0_4_ + fVar154;
    auVar237._4_4_ = auVar100._4_4_ + fVar181;
    auVar237._8_4_ = auVar100._8_4_ + fVar183;
    auVar237._12_4_ = auVar100._12_4_ + fVar185;
    auVar237._16_4_ = auVar100._16_4_ + fVar187;
    auVar237._20_4_ = auVar100._20_4_ + fVar189;
    auVar237._24_4_ = auVar100._24_4_ + fVar211;
    auVar237._28_4_ = auVar100._28_4_ + fVar155;
    auVar111 = vmaxps_avx(auVar100,auVar237);
    auVar116 = vminps_avx512vl(auVar100,auVar237);
    auVar119 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar98);
    auVar120 = vpermt2ps_avx512vl(auVar254,_DAT_01fb9fc0,auVar98);
    auVar121 = vpermt2ps_avx512vl(auVar257,_DAT_01fb9fc0,auVar98);
    auVar131 = ZEXT1632(auVar87);
    auVar122 = vpermt2ps_avx512vl(auVar137,_DAT_01fb9fc0,auVar131);
    auVar100 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar131);
    auVar100 = vsubps_avx(auVar119,auVar100);
    auVar98 = vsubps_avx(auVar113,ZEXT1632(auVar85));
    auVar99 = vsubps_avx(auVar114,auVar117);
    auVar112 = vsubps_avx(auVar115,auVar118);
    auVar123 = vmulps_avx512vl(auVar99,auVar137);
    auVar123 = vfmsub231ps_avx512vl(auVar123,auVar257,auVar112);
    auVar124 = vmulps_avx512vl(auVar112,auVar254);
    auVar124 = vfmsub231ps_avx512vl(auVar124,auVar137,auVar98);
    auVar125 = vmulps_avx512vl(auVar98,auVar257);
    auVar125 = vfmsub231ps_avx512vl(auVar125,auVar254,auVar99);
    auVar125 = vmulps_avx512vl(auVar125,auVar125);
    auVar124 = vfmadd231ps_avx512vl(auVar125,auVar124,auVar124);
    auVar123 = vfmadd231ps_avx512vl(auVar124,auVar123,auVar123);
    auVar124 = vmulps_avx512vl(auVar112,auVar112);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar99,auVar99);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar98,auVar98);
    auVar125 = vrcp14ps_avx512vl(auVar124);
    auVar126 = vfnmadd213ps_avx512vl(auVar125,auVar124,auVar262);
    auVar125 = vfmadd132ps_avx512vl(auVar126,auVar125,auVar125);
    auVar123 = vmulps_avx512vl(auVar123,auVar125);
    auVar126 = vmulps_avx512vl(auVar99,auVar122);
    auVar126 = vfmsub231ps_avx512vl(auVar126,auVar121,auVar112);
    auVar127 = vmulps_avx512vl(auVar112,auVar120);
    auVar127 = vfmsub231ps_avx512vl(auVar127,auVar122,auVar98);
    auVar128 = vmulps_avx512vl(auVar98,auVar121);
    auVar128 = vfmsub231ps_avx512vl(auVar128,auVar120,auVar99);
    auVar128 = vmulps_avx512vl(auVar128,auVar128);
    auVar127 = vfmadd231ps_avx512vl(auVar128,auVar127,auVar127);
    auVar126 = vfmadd231ps_avx512vl(auVar127,auVar126,auVar126);
    auVar125 = vmulps_avx512vl(auVar126,auVar125);
    auVar123 = vmaxps_avx512vl(auVar123,auVar125);
    auVar123 = vsqrtps_avx512vl(auVar123);
    auVar125 = vmaxps_avx512vl(auVar100,auVar119);
    auVar111 = vmaxps_avx512vl(auVar111,auVar125);
    auVar125 = vaddps_avx512vl(auVar123,auVar111);
    auVar111 = vminps_avx(auVar100,auVar119);
    auVar111 = vminps_avx512vl(auVar116,auVar111);
    auVar111 = vsubps_avx512vl(auVar111,auVar123);
    auVar126._8_4_ = 0x3f800002;
    auVar126._0_8_ = 0x3f8000023f800002;
    auVar126._12_4_ = 0x3f800002;
    auVar126._16_4_ = 0x3f800002;
    auVar126._20_4_ = 0x3f800002;
    auVar126._24_4_ = 0x3f800002;
    auVar126._28_4_ = 0x3f800002;
    auVar100 = vmulps_avx512vl(auVar125,auVar126);
    auVar127._8_4_ = 0x3f7ffffc;
    auVar127._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar127._12_4_ = 0x3f7ffffc;
    auVar127._16_4_ = 0x3f7ffffc;
    auVar127._20_4_ = 0x3f7ffffc;
    auVar127._24_4_ = 0x3f7ffffc;
    auVar127._28_4_ = 0x3f7ffffc;
    local_ac0 = vmulps_avx512vl(auVar111,auVar127);
    auVar111 = vmulps_avx512vl(auVar100,auVar100);
    auVar100 = vrsqrt14ps_avx512vl(auVar124);
    auVar128._8_4_ = 0xbf000000;
    auVar128._0_8_ = 0xbf000000bf000000;
    auVar128._12_4_ = 0xbf000000;
    auVar128._16_4_ = 0xbf000000;
    auVar128._20_4_ = 0xbf000000;
    auVar128._24_4_ = 0xbf000000;
    auVar128._28_4_ = 0xbf000000;
    auVar116 = vmulps_avx512vl(auVar124,auVar128);
    fVar154 = auVar100._0_4_;
    fVar181 = auVar100._4_4_;
    fVar183 = auVar100._8_4_;
    fVar185 = auVar100._12_4_;
    fVar155 = auVar100._16_4_;
    fVar187 = auVar100._20_4_;
    fVar189 = auVar100._24_4_;
    auVar45._4_4_ = fVar181 * fVar181 * fVar181 * auVar116._4_4_;
    auVar45._0_4_ = fVar154 * fVar154 * fVar154 * auVar116._0_4_;
    auVar45._8_4_ = fVar183 * fVar183 * fVar183 * auVar116._8_4_;
    auVar45._12_4_ = fVar185 * fVar185 * fVar185 * auVar116._12_4_;
    auVar45._16_4_ = fVar155 * fVar155 * fVar155 * auVar116._16_4_;
    auVar45._20_4_ = fVar187 * fVar187 * fVar187 * auVar116._20_4_;
    auVar45._24_4_ = fVar189 * fVar189 * fVar189 * auVar116._24_4_;
    auVar45._28_4_ = auVar125._28_4_;
    auVar129._8_4_ = 0x3fc00000;
    auVar129._0_8_ = 0x3fc000003fc00000;
    auVar129._12_4_ = 0x3fc00000;
    auVar129._16_4_ = 0x3fc00000;
    auVar129._20_4_ = 0x3fc00000;
    auVar129._24_4_ = 0x3fc00000;
    auVar129._28_4_ = 0x3fc00000;
    auVar100 = vfmadd231ps_avx512vl(auVar45,auVar100,auVar129);
    auVar261 = ZEXT3264(auVar100);
    auVar116 = vmulps_avx512vl(auVar98,auVar100);
    auVar119 = vmulps_avx512vl(auVar99,auVar100);
    auVar123 = vmulps_avx512vl(auVar112,auVar100);
    auVar231 = ZEXT1632(auVar85);
    auVar124 = vsubps_avx512vl(auVar131,auVar231);
    auVar125 = vsubps_avx512vl(auVar131,auVar117);
    auVar126 = vsubps_avx512vl(auVar131,auVar118);
    auVar127 = vmulps_avx512vl(_local_740,auVar126);
    auVar127 = vfmadd231ps_avx512vl(auVar127,local_720,auVar125);
    auVar127 = vfmadd231ps_avx512vl(auVar127,local_700,auVar124);
    auVar128 = vmulps_avx512vl(auVar126,auVar126);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar125,auVar125);
    auVar128 = vfmadd231ps_avx512vl(auVar128,auVar124,auVar124);
    auVar129 = vmulps_avx512vl(_local_740,auVar123);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar119,local_720);
    auVar129 = vfmadd231ps_avx512vl(auVar129,auVar116,local_700);
    auVar123 = vmulps_avx512vl(auVar126,auVar123);
    auVar119 = vfmadd231ps_avx512vl(auVar123,auVar125,auVar119);
    auVar116 = vfmadd231ps_avx512vl(auVar119,auVar124,auVar116);
    auVar119 = vmulps_avx512vl(auVar129,auVar129);
    auVar123 = vsubps_avx512vl(auVar110,auVar119);
    auVar130 = vmulps_avx512vl(auVar129,auVar116);
    auVar127 = vsubps_avx512vl(auVar127,auVar130);
    auVar127 = vaddps_avx512vl(auVar127,auVar127);
    auVar130 = vmulps_avx512vl(auVar116,auVar116);
    auVar128 = vsubps_avx512vl(auVar128,auVar130);
    auVar111 = vsubps_avx512vl(auVar128,auVar111);
    local_760 = vmulps_avx512vl(auVar127,auVar127);
    auVar130._8_4_ = 0x40800000;
    auVar130._0_8_ = 0x4080000040800000;
    auVar130._12_4_ = 0x40800000;
    auVar130._16_4_ = 0x40800000;
    auVar130._20_4_ = 0x40800000;
    auVar130._24_4_ = 0x40800000;
    auVar130._28_4_ = 0x40800000;
    _local_780 = vmulps_avx512vl(auVar123,auVar130);
    auVar130 = vmulps_avx512vl(_local_780,auVar111);
    auVar130 = vsubps_avx512vl(local_760,auVar130);
    uVar78 = vcmpps_avx512vl(auVar130,auVar131,5);
    bVar71 = (byte)uVar78;
    fVar154 = (float)local_960._0_4_;
    fVar181 = (float)local_960._4_4_;
    fVar183 = fStack_958;
    fVar185 = fStack_954;
    fVar155 = fStack_950;
    fVar187 = fStack_94c;
    fVar189 = fStack_948;
    fVar211 = fStack_944;
    if (bVar71 == 0) {
LAB_01a7f2fc:
      auVar168 = ZEXT3264(_DAT_01f7b040);
      auVar251 = ZEXT3264(local_a20);
      auVar256 = ZEXT3264(local_a40);
      auVar258 = ZEXT3264(local_a60);
      auVar248 = ZEXT3264(local_9c0);
      auVar243 = ZEXT3264(local_9e0);
      auVar250 = ZEXT3264(local_a00);
      auVar253 = ZEXT3264(local_a80);
    }
    else {
      local_8c0._0_32_ = auVar128;
      auVar130 = vsqrtps_avx512vl(auVar130);
      auVar131 = vaddps_avx512vl(auVar123,auVar123);
      local_940 = vrcp14ps_avx512vl(auVar131);
      in_ZMM31 = ZEXT3264(local_940);
      auVar132 = vfnmadd213ps_avx512vl(local_940,auVar131,auVar262);
      auVar132 = vfmadd132ps_avx512vl(auVar132,local_940,local_940);
      auVar262._8_4_ = 0x80000000;
      auVar262._0_8_ = 0x8000000080000000;
      auVar262._12_4_ = 0x80000000;
      auVar262._16_4_ = 0x80000000;
      auVar262._20_4_ = 0x80000000;
      auVar262._24_4_ = 0x80000000;
      auVar262._28_4_ = 0x80000000;
      local_7a0 = vxorps_avx512vl(auVar127,auVar262);
      auVar133 = vsubps_avx512vl(local_7a0,auVar130);
      local_880 = vmulps_avx512vl(auVar133,auVar132);
      auVar130 = vsubps_avx512vl(auVar130,auVar127);
      local_980 = vmulps_avx512vl(auVar130,auVar132);
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar132 = vblendmps_avx512vl(auVar130,local_880);
      auVar134._0_4_ =
           (uint)(bVar71 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar130._0_4_;
      bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar134._4_4_ = (uint)bVar80 * auVar132._4_4_ | (uint)!bVar80 * auVar130._4_4_;
      bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar134._8_4_ = (uint)bVar80 * auVar132._8_4_ | (uint)!bVar80 * auVar130._8_4_;
      bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar134._12_4_ = (uint)bVar80 * auVar132._12_4_ | (uint)!bVar80 * auVar130._12_4_;
      bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar134._16_4_ = (uint)bVar80 * auVar132._16_4_ | (uint)!bVar80 * auVar130._16_4_;
      bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar134._20_4_ = (uint)bVar80 * auVar132._20_4_ | (uint)!bVar80 * auVar130._20_4_;
      bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar134._24_4_ = (uint)bVar80 * auVar132._24_4_ | (uint)!bVar80 * auVar130._24_4_;
      bVar80 = SUB81(uVar78 >> 7,0);
      auVar134._28_4_ = (uint)bVar80 * auVar132._28_4_ | (uint)!bVar80 * auVar130._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar132 = vblendmps_avx512vl(auVar130,local_980);
      auVar135._0_4_ =
           (uint)(bVar71 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar130._0_4_;
      bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
      auVar135._4_4_ = (uint)bVar80 * auVar132._4_4_ | (uint)!bVar80 * auVar130._4_4_;
      bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
      auVar135._8_4_ = (uint)bVar80 * auVar132._8_4_ | (uint)!bVar80 * auVar130._8_4_;
      bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
      auVar135._12_4_ = (uint)bVar80 * auVar132._12_4_ | (uint)!bVar80 * auVar130._12_4_;
      bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
      auVar135._16_4_ = (uint)bVar80 * auVar132._16_4_ | (uint)!bVar80 * auVar130._16_4_;
      bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
      auVar135._20_4_ = (uint)bVar80 * auVar132._20_4_ | (uint)!bVar80 * auVar130._20_4_;
      bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
      auVar135._24_4_ = (uint)bVar80 * auVar132._24_4_ | (uint)!bVar80 * auVar130._24_4_;
      bVar80 = SUB81(uVar78 >> 7,0);
      auVar135._28_4_ = (uint)bVar80 * auVar132._28_4_ | (uint)!bVar80 * auVar130._28_4_;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar119,auVar130);
      local_7c0 = vmaxps_avx512vl(local_560,auVar130);
      auVar38._8_4_ = 0x36000000;
      auVar38._0_8_ = 0x3600000036000000;
      auVar38._12_4_ = 0x36000000;
      auVar38._16_4_ = 0x36000000;
      auVar38._20_4_ = 0x36000000;
      auVar38._24_4_ = 0x36000000;
      auVar38._28_4_ = 0x36000000;
      local_7e0 = vmulps_avx512vl(local_7c0,auVar38);
      vandps_avx512vl(auVar123,auVar130);
      uVar25 = vcmpps_avx512vl(local_7e0,local_7e0,1);
      uVar78 = uVar78 & uVar25;
      bVar77 = (byte)uVar78;
      if (bVar77 != 0) {
        uVar25 = vcmpps_avx512vl(auVar111,_DAT_01f7b000,2);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar123 = vblendmps_avx512vl(auVar111,auVar119);
        bVar75 = (byte)uVar25;
        uVar83 = (uint)(bVar75 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar75 & 1) * local_7e0._0_4_;
        bVar80 = (bool)((byte)(uVar25 >> 1) & 1);
        uVar147 = (uint)bVar80 * auVar123._4_4_ | (uint)!bVar80 * local_7e0._4_4_;
        bVar80 = (bool)((byte)(uVar25 >> 2) & 1);
        uVar148 = (uint)bVar80 * auVar123._8_4_ | (uint)!bVar80 * local_7e0._8_4_;
        bVar80 = (bool)((byte)(uVar25 >> 3) & 1);
        uVar149 = (uint)bVar80 * auVar123._12_4_ | (uint)!bVar80 * local_7e0._12_4_;
        bVar80 = (bool)((byte)(uVar25 >> 4) & 1);
        uVar150 = (uint)bVar80 * auVar123._16_4_ | (uint)!bVar80 * local_7e0._16_4_;
        bVar80 = (bool)((byte)(uVar25 >> 5) & 1);
        uVar151 = (uint)bVar80 * auVar123._20_4_ | (uint)!bVar80 * local_7e0._20_4_;
        bVar80 = (bool)((byte)(uVar25 >> 6) & 1);
        uVar152 = (uint)bVar80 * auVar123._24_4_ | (uint)!bVar80 * local_7e0._24_4_;
        bVar80 = SUB81(uVar25 >> 7,0);
        uVar153 = (uint)bVar80 * auVar123._28_4_ | (uint)!bVar80 * local_7e0._28_4_;
        auVar134._0_4_ = (bVar77 & 1) * uVar83 | !(bool)(bVar77 & 1) * auVar134._0_4_;
        bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar134._4_4_ = bVar80 * uVar147 | !bVar80 * auVar134._4_4_;
        bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar134._8_4_ = bVar80 * uVar148 | !bVar80 * auVar134._8_4_;
        bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar134._12_4_ = bVar80 * uVar149 | !bVar80 * auVar134._12_4_;
        bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar134._16_4_ = bVar80 * uVar150 | !bVar80 * auVar134._16_4_;
        bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar134._20_4_ = bVar80 * uVar151 | !bVar80 * auVar134._20_4_;
        bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar134._24_4_ = bVar80 * uVar152 | !bVar80 * auVar134._24_4_;
        bVar80 = SUB81(uVar78 >> 7,0);
        auVar134._28_4_ = bVar80 * uVar153 | !bVar80 * auVar134._28_4_;
        auVar111 = vblendmps_avx512vl(auVar119,auVar111);
        bVar80 = (bool)((byte)(uVar25 >> 1) & 1);
        bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
        bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
        bVar13 = (bool)((byte)(uVar25 >> 4) & 1);
        bVar14 = (bool)((byte)(uVar25 >> 5) & 1);
        bVar15 = (bool)((byte)(uVar25 >> 6) & 1);
        bVar16 = SUB81(uVar25 >> 7,0);
        auVar135._0_4_ =
             (uint)(bVar77 & 1) *
             ((uint)(bVar75 & 1) * auVar111._0_4_ | !(bool)(bVar75 & 1) * uVar83) |
             !(bool)(bVar77 & 1) * auVar135._0_4_;
        bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar135._4_4_ =
             (uint)bVar10 * ((uint)bVar80 * auVar111._4_4_ | !bVar80 * uVar147) |
             !bVar10 * auVar135._4_4_;
        bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar135._8_4_ =
             (uint)bVar80 * ((uint)bVar11 * auVar111._8_4_ | !bVar11 * uVar148) |
             !bVar80 * auVar135._8_4_;
        bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar135._12_4_ =
             (uint)bVar80 * ((uint)bVar12 * auVar111._12_4_ | !bVar12 * uVar149) |
             !bVar80 * auVar135._12_4_;
        bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar135._16_4_ =
             (uint)bVar80 * ((uint)bVar13 * auVar111._16_4_ | !bVar13 * uVar150) |
             !bVar80 * auVar135._16_4_;
        bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar135._20_4_ =
             (uint)bVar80 * ((uint)bVar14 * auVar111._20_4_ | !bVar14 * uVar151) |
             !bVar80 * auVar135._20_4_;
        bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar135._24_4_ =
             (uint)bVar80 * ((uint)bVar15 * auVar111._24_4_ | !bVar15 * uVar152) |
             !bVar80 * auVar135._24_4_;
        bVar80 = SUB81(uVar78 >> 7,0);
        auVar135._28_4_ =
             (uint)bVar80 * ((uint)bVar16 * auVar111._28_4_ | !bVar16 * uVar153) |
             !bVar80 * auVar135._28_4_;
        bVar71 = (~bVar77 | bVar75) & bVar71;
      }
      if ((bVar71 & 0x7f) == 0) {
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar263 = ZEXT3264(auVar111);
        auVar168 = ZEXT3264(_DAT_01f7b040);
        auVar251 = ZEXT3264(local_a20);
        auVar256 = ZEXT3264(local_a40);
        auVar258 = ZEXT3264(local_a60);
        auVar248 = ZEXT3264(local_9c0);
        auVar243 = ZEXT3264(local_9e0);
        auVar250 = ZEXT3264(local_a00);
        auVar253 = ZEXT3264(local_a80);
      }
      else {
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar119 = vxorps_avx512vl(auVar122,auVar111);
        auVar120 = vxorps_avx512vl(auVar120,auVar111);
        auVar168 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar121 = vxorps_avx512vl(auVar121,auVar111);
        auVar87 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_920._0_4_));
        auVar122 = vbroadcastss_avx512vl(auVar87);
        auVar122 = vminps_avx512vl(auVar122,auVar135);
        auVar70._4_4_ = fStack_57c;
        auVar70._0_4_ = local_580;
        auVar70._8_4_ = fStack_578;
        auVar70._12_4_ = fStack_574;
        auVar70._16_4_ = fStack_570;
        auVar70._20_4_ = fStack_56c;
        auVar70._24_4_ = fStack_568;
        auVar70._28_4_ = fStack_564;
        auVar123 = vmaxps_avx512vl(auVar70,auVar134);
        auVar126 = vmulps_avx512vl(auVar126,auVar137);
        auVar125 = vfmadd213ps_avx512vl(auVar125,auVar257,auVar126);
        auVar87 = vfmadd213ps_fma(auVar124,auVar254,auVar125);
        in_ZMM31 = ZEXT3264(_local_740);
        auVar124 = vmulps_avx512vl(_local_740,auVar137);
        auVar124 = vfmadd231ps_avx512vl(auVar124,local_720,auVar257);
        auVar124 = vfmadd231ps_avx512vl(auVar124,local_700,auVar254);
        auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar124,auVar125);
        auVar126 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar24 = vcmpps_avx512vl(auVar125,auVar126,1);
        auVar130 = vxorps_avx512vl(ZEXT1632(auVar87),auVar111);
        auVar132 = vrcp14ps_avx512vl(auVar124);
        auVar133 = vxorps_avx512vl(auVar124,auVar111);
        auVar136 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar137 = vfnmadd213ps_avx512vl(auVar132,auVar124,auVar136);
        auVar87 = vfmadd132ps_fma(auVar137,auVar132,auVar132);
        fVar169 = auVar87._0_4_ * auVar130._0_4_;
        fVar182 = auVar87._4_4_ * auVar130._4_4_;
        auVar46._4_4_ = fVar182;
        auVar46._0_4_ = fVar169;
        fVar184 = auVar87._8_4_ * auVar130._8_4_;
        auVar46._8_4_ = fVar184;
        fVar186 = auVar87._12_4_ * auVar130._12_4_;
        auVar46._12_4_ = fVar186;
        fVar188 = auVar130._16_4_ * 0.0;
        auVar46._16_4_ = fVar188;
        fVar190 = auVar130._20_4_ * 0.0;
        auVar46._20_4_ = fVar190;
        fVar191 = auVar130._24_4_ * 0.0;
        auVar46._24_4_ = fVar191;
        auVar46._28_4_ = auVar130._28_4_;
        uVar27 = vcmpps_avx512vl(auVar124,auVar133,1);
        bVar77 = (byte)uVar24 | (byte)uVar27;
        auVar259._8_4_ = 0xff800000;
        auVar259._0_8_ = 0xff800000ff800000;
        auVar259._12_4_ = 0xff800000;
        auVar259._16_4_ = 0xff800000;
        auVar259._20_4_ = 0xff800000;
        auVar259._24_4_ = 0xff800000;
        auVar259._28_4_ = 0xff800000;
        auVar137 = vblendmps_avx512vl(auVar46,auVar259);
        auVar138._0_4_ =
             (uint)(bVar77 & 1) * auVar137._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar132._0_4_;
        bVar80 = (bool)(bVar77 >> 1 & 1);
        auVar138._4_4_ = (uint)bVar80 * auVar137._4_4_ | (uint)!bVar80 * auVar132._4_4_;
        bVar80 = (bool)(bVar77 >> 2 & 1);
        auVar138._8_4_ = (uint)bVar80 * auVar137._8_4_ | (uint)!bVar80 * auVar132._8_4_;
        bVar80 = (bool)(bVar77 >> 3 & 1);
        auVar138._12_4_ = (uint)bVar80 * auVar137._12_4_ | (uint)!bVar80 * auVar132._12_4_;
        bVar80 = (bool)(bVar77 >> 4 & 1);
        auVar138._16_4_ = (uint)bVar80 * auVar137._16_4_ | (uint)!bVar80 * auVar132._16_4_;
        bVar80 = (bool)(bVar77 >> 5 & 1);
        auVar138._20_4_ = (uint)bVar80 * auVar137._20_4_ | (uint)!bVar80 * auVar132._20_4_;
        bVar80 = (bool)(bVar77 >> 6 & 1);
        auVar138._24_4_ = (uint)bVar80 * auVar137._24_4_ | (uint)!bVar80 * auVar132._24_4_;
        auVar138._28_4_ =
             (uint)(bVar77 >> 7) * auVar137._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar132._28_4_;
        auVar123 = vmaxps_avx512vl(auVar123,auVar138);
        uVar27 = vcmpps_avx512vl(auVar124,auVar133,6);
        bVar77 = (byte)uVar24 | (byte)uVar27;
        auVar124 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar139._0_4_ =
             (uint)(bVar77 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar169;
        bVar80 = (bool)(bVar77 >> 1 & 1);
        auVar139._4_4_ = (uint)bVar80 * auVar124._4_4_ | (uint)!bVar80 * (int)fVar182;
        bVar80 = (bool)(bVar77 >> 2 & 1);
        auVar139._8_4_ = (uint)bVar80 * auVar124._8_4_ | (uint)!bVar80 * (int)fVar184;
        bVar80 = (bool)(bVar77 >> 3 & 1);
        auVar139._12_4_ = (uint)bVar80 * auVar124._12_4_ | (uint)!bVar80 * (int)fVar186;
        bVar80 = (bool)(bVar77 >> 4 & 1);
        auVar139._16_4_ = (uint)bVar80 * auVar124._16_4_ | (uint)!bVar80 * (int)fVar188;
        bVar80 = (bool)(bVar77 >> 5 & 1);
        auVar139._20_4_ = (uint)bVar80 * auVar124._20_4_ | (uint)!bVar80 * (int)fVar190;
        bVar80 = (bool)(bVar77 >> 6 & 1);
        auVar139._24_4_ = (uint)bVar80 * auVar124._24_4_ | (uint)!bVar80 * (int)fVar191;
        auVar139._28_4_ =
             (uint)(bVar77 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar130._28_4_;
        auVar130 = vminps_avx512vl(auVar122,auVar139);
        auVar87 = vxorps_avx512vl(auVar122._0_16_,auVar122._0_16_);
        auVar113 = vsubps_avx512vl(ZEXT1632(auVar87),auVar113);
        auVar114 = vsubps_avx512vl(ZEXT1632(auVar87),auVar114);
        auVar122 = ZEXT1632(auVar87);
        auVar115 = vsubps_avx512vl(auVar122,auVar115);
        auVar115 = vmulps_avx512vl(auVar115,auVar119);
        auVar114 = vfmadd231ps_avx512vl(auVar115,auVar121,auVar114);
        auVar113 = vfmadd231ps_avx512vl(auVar114,auVar120,auVar113);
        auVar114 = vmulps_avx512vl(_local_740,auVar119);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_720,auVar121);
        auVar114 = vfmadd231ps_avx512vl(auVar114,local_700,auVar120);
        vandps_avx512vl(auVar114,auVar125);
        uVar24 = vcmpps_avx512vl(auVar114,auVar126,1);
        auVar113 = vxorps_avx512vl(auVar113,auVar111);
        auVar115 = vrcp14ps_avx512vl(auVar114);
        auVar111 = vxorps_avx512vl(auVar114,auVar111);
        auVar119 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar136);
        auVar87 = vfmadd132ps_fma(auVar119,auVar115,auVar115);
        fVar169 = auVar87._0_4_ * auVar113._0_4_;
        fVar182 = auVar87._4_4_ * auVar113._4_4_;
        auVar47._4_4_ = fVar182;
        auVar47._0_4_ = fVar169;
        fVar184 = auVar87._8_4_ * auVar113._8_4_;
        auVar47._8_4_ = fVar184;
        fVar186 = auVar87._12_4_ * auVar113._12_4_;
        auVar47._12_4_ = fVar186;
        fVar188 = auVar113._16_4_ * 0.0;
        auVar47._16_4_ = fVar188;
        fVar190 = auVar113._20_4_ * 0.0;
        auVar47._20_4_ = fVar190;
        fVar191 = auVar113._24_4_ * 0.0;
        auVar47._24_4_ = fVar191;
        auVar47._28_4_ = auVar113._28_4_;
        uVar27 = vcmpps_avx512vl(auVar114,auVar111,1);
        bVar77 = (byte)uVar24 | (byte)uVar27;
        auVar119 = vblendmps_avx512vl(auVar47,auVar259);
        auVar140._0_4_ =
             (uint)(bVar77 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar77 & 1) * auVar115._0_4_;
        bVar80 = (bool)(bVar77 >> 1 & 1);
        auVar140._4_4_ = (uint)bVar80 * auVar119._4_4_ | (uint)!bVar80 * auVar115._4_4_;
        bVar80 = (bool)(bVar77 >> 2 & 1);
        auVar140._8_4_ = (uint)bVar80 * auVar119._8_4_ | (uint)!bVar80 * auVar115._8_4_;
        bVar80 = (bool)(bVar77 >> 3 & 1);
        auVar140._12_4_ = (uint)bVar80 * auVar119._12_4_ | (uint)!bVar80 * auVar115._12_4_;
        bVar80 = (bool)(bVar77 >> 4 & 1);
        auVar140._16_4_ = (uint)bVar80 * auVar119._16_4_ | (uint)!bVar80 * auVar115._16_4_;
        bVar80 = (bool)(bVar77 >> 5 & 1);
        auVar140._20_4_ = (uint)bVar80 * auVar119._20_4_ | (uint)!bVar80 * auVar115._20_4_;
        bVar80 = (bool)(bVar77 >> 6 & 1);
        auVar140._24_4_ = (uint)bVar80 * auVar119._24_4_ | (uint)!bVar80 * auVar115._24_4_;
        auVar140._28_4_ =
             (uint)(bVar77 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar115._28_4_;
        local_6e0 = vmaxps_avx(auVar123,auVar140);
        uVar27 = vcmpps_avx512vl(auVar114,auVar111,6);
        bVar77 = (byte)uVar24 | (byte)uVar27;
        auVar141._0_4_ =
             (uint)(bVar77 & 1) * auVar124._0_4_ | (uint)!(bool)(bVar77 & 1) * (int)fVar169;
        bVar80 = (bool)(bVar77 >> 1 & 1);
        auVar141._4_4_ = (uint)bVar80 * auVar124._4_4_ | (uint)!bVar80 * (int)fVar182;
        bVar80 = (bool)(bVar77 >> 2 & 1);
        auVar141._8_4_ = (uint)bVar80 * auVar124._8_4_ | (uint)!bVar80 * (int)fVar184;
        bVar80 = (bool)(bVar77 >> 3 & 1);
        auVar141._12_4_ = (uint)bVar80 * auVar124._12_4_ | (uint)!bVar80 * (int)fVar186;
        bVar80 = (bool)(bVar77 >> 4 & 1);
        auVar141._16_4_ = (uint)bVar80 * auVar124._16_4_ | (uint)!bVar80 * (int)fVar188;
        bVar80 = (bool)(bVar77 >> 5 & 1);
        auVar141._20_4_ = (uint)bVar80 * auVar124._20_4_ | (uint)!bVar80 * (int)fVar190;
        bVar80 = (bool)(bVar77 >> 6 & 1);
        auVar141._24_4_ = (uint)bVar80 * auVar124._24_4_ | (uint)!bVar80 * (int)fVar191;
        auVar141._28_4_ =
             (uint)(bVar77 >> 7) * auVar124._28_4_ | (uint)!(bool)(bVar77 >> 7) * auVar113._28_4_;
        local_5e0 = vminps_avx(auVar130,auVar141);
        uVar24 = vcmpps_avx512vl(local_6e0,local_5e0,2);
        bVar71 = bVar71 & 0x7f & (byte)uVar24;
        if (bVar71 == 0) {
          auVar263 = ZEXT3264(auVar136);
          goto LAB_01a7f2fc;
        }
        auVar113 = vmaxps_avx512vl(auVar122,local_ac0);
        auVar111 = vfmadd213ps_avx512vl(local_880,auVar129,auVar116);
        fVar169 = auVar100._0_4_;
        fVar182 = auVar100._4_4_;
        auVar48._4_4_ = fVar182 * auVar111._4_4_;
        auVar48._0_4_ = fVar169 * auVar111._0_4_;
        fVar184 = auVar100._8_4_;
        auVar48._8_4_ = fVar184 * auVar111._8_4_;
        fVar186 = auVar100._12_4_;
        auVar48._12_4_ = fVar186 * auVar111._12_4_;
        fVar188 = auVar100._16_4_;
        auVar48._16_4_ = fVar188 * auVar111._16_4_;
        fVar190 = auVar100._20_4_;
        auVar48._20_4_ = fVar190 * auVar111._20_4_;
        fVar191 = auVar100._24_4_;
        auVar48._24_4_ = fVar191 * auVar111._24_4_;
        auVar48._28_4_ = auVar111._28_4_;
        auVar111 = vfmadd213ps_avx512vl(local_980,auVar129,auVar116);
        auVar49._4_4_ = fVar182 * auVar111._4_4_;
        auVar49._0_4_ = fVar169 * auVar111._0_4_;
        auVar49._8_4_ = fVar184 * auVar111._8_4_;
        auVar49._12_4_ = fVar186 * auVar111._12_4_;
        auVar49._16_4_ = fVar188 * auVar111._16_4_;
        auVar49._20_4_ = fVar190 * auVar111._20_4_;
        auVar49._24_4_ = fVar191 * auVar111._24_4_;
        auVar49._28_4_ = auVar111._28_4_;
        auVar111 = vminps_avx512vl(auVar48,auVar136);
        auVar114 = ZEXT832(0) << 0x20;
        auVar111 = vmaxps_avx(auVar111,ZEXT832(0) << 0x20);
        auVar115 = vminps_avx512vl(auVar49,auVar136);
        auVar50._4_4_ = (auVar111._4_4_ + 1.0) * 0.125;
        auVar50._0_4_ = (auVar111._0_4_ + 0.0) * 0.125;
        auVar50._8_4_ = (auVar111._8_4_ + 2.0) * 0.125;
        auVar50._12_4_ = (auVar111._12_4_ + 3.0) * 0.125;
        auVar50._16_4_ = (auVar111._16_4_ + 4.0) * 0.125;
        auVar50._20_4_ = (auVar111._20_4_ + 5.0) * 0.125;
        auVar50._24_4_ = (auVar111._24_4_ + 6.0) * 0.125;
        auVar50._28_4_ = auVar111._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar50,auVar225,auVar206);
        auVar111 = vmaxps_avx(auVar115,ZEXT832(0) << 0x20);
        auVar51._4_4_ = (auVar111._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar111._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar111._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar111._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar111._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar111._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar111._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar111._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar51,auVar225,auVar206);
        auVar52._4_4_ = auVar113._4_4_ * auVar113._4_4_;
        auVar52._0_4_ = auVar113._0_4_ * auVar113._0_4_;
        auVar52._8_4_ = auVar113._8_4_ * auVar113._8_4_;
        auVar52._12_4_ = auVar113._12_4_ * auVar113._12_4_;
        auVar52._16_4_ = auVar113._16_4_ * auVar113._16_4_;
        auVar52._20_4_ = auVar113._20_4_ * auVar113._20_4_;
        auVar52._24_4_ = auVar113._24_4_ * auVar113._24_4_;
        auVar52._28_4_ = auVar113._28_4_;
        auVar111 = vsubps_avx(auVar128,auVar52);
        auVar53._4_4_ = auVar111._4_4_ * (float)local_780._4_4_;
        auVar53._0_4_ = auVar111._0_4_ * (float)local_780._0_4_;
        auVar53._8_4_ = auVar111._8_4_ * fStack_778;
        auVar53._12_4_ = auVar111._12_4_ * fStack_774;
        auVar53._16_4_ = auVar111._16_4_ * fStack_770;
        auVar53._20_4_ = auVar111._20_4_ * fStack_76c;
        auVar53._24_4_ = auVar111._24_4_ * fStack_768;
        auVar53._28_4_ = auVar113._28_4_;
        auVar113 = vsubps_avx(local_760,auVar53);
        uVar24 = vcmpps_avx512vl(auVar113,ZEXT832(0) << 0x20,5);
        bVar77 = (byte)uVar24;
        if (bVar77 == 0) {
          bVar77 = 0;
          auVar100 = ZEXT832(0) << 0x20;
          auVar243 = ZEXT864(0) << 0x20;
          auVar113 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar115 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar252 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar142._8_4_ = 0x7f800000;
          auVar142._0_8_ = 0x7f8000007f800000;
          auVar142._12_4_ = 0x7f800000;
          auVar142._16_4_ = 0x7f800000;
          auVar142._20_4_ = 0x7f800000;
          auVar142._24_4_ = 0x7f800000;
          auVar142._28_4_ = 0x7f800000;
          auVar143._8_4_ = 0xff800000;
          auVar143._0_8_ = 0xff800000ff800000;
          auVar143._12_4_ = 0xff800000;
          auVar143._16_4_ = 0xff800000;
          auVar143._20_4_ = 0xff800000;
          auVar143._24_4_ = 0xff800000;
          auVar143._28_4_ = 0xff800000;
        }
        else {
          auVar88 = vxorps_avx512vl(auVar125._0_16_,auVar125._0_16_);
          uVar78 = vcmpps_avx512vl(auVar113,auVar122,5);
          auVar113 = vsqrtps_avx(auVar113);
          auVar114 = vfnmadd213ps_avx512vl(auVar131,local_940,auVar136);
          auVar119 = vfmadd132ps_avx512vl(auVar114,local_940,local_940);
          auVar114 = vsubps_avx(local_7a0,auVar113);
          auVar120 = vmulps_avx512vl(auVar114,auVar119);
          auVar113 = vsubps_avx512vl(auVar113,auVar127);
          auVar119 = vmulps_avx512vl(auVar113,auVar119);
          auVar113 = vfmadd213ps_avx512vl(auVar129,auVar120,auVar116);
          auVar54._4_4_ = fVar182 * auVar113._4_4_;
          auVar54._0_4_ = fVar169 * auVar113._0_4_;
          auVar54._8_4_ = fVar184 * auVar113._8_4_;
          auVar54._12_4_ = fVar186 * auVar113._12_4_;
          auVar54._16_4_ = fVar188 * auVar113._16_4_;
          auVar54._20_4_ = fVar190 * auVar113._20_4_;
          auVar54._24_4_ = fVar191 * auVar113._24_4_;
          auVar54._28_4_ = auVar115._28_4_;
          auVar113 = vmulps_avx512vl(local_700,auVar120);
          auVar114 = vmulps_avx512vl(local_720,auVar120);
          auVar121 = vmulps_avx512vl(_local_740,auVar120);
          auVar115 = vfmadd213ps_avx512vl(auVar98,auVar54,auVar231);
          auVar113 = vsubps_avx512vl(auVar113,auVar115);
          auVar115 = vfmadd213ps_avx512vl(auVar99,auVar54,auVar117);
          auVar115 = vsubps_avx512vl(auVar114,auVar115);
          auVar87 = vfmadd213ps_fma(auVar54,auVar112,auVar118);
          auVar114 = vsubps_avx(auVar121,ZEXT1632(auVar87));
          auVar252 = auVar114._0_28_;
          auVar114 = vfmadd213ps_avx512vl(auVar129,auVar119,auVar116);
          auVar116 = vmulps_avx512vl(auVar100,auVar114);
          auVar261 = ZEXT3264(auVar116);
          auVar100 = vmulps_avx512vl(local_700,auVar119);
          auVar121 = vmulps_avx512vl(local_720,auVar119);
          auVar122 = vmulps_avx512vl(_local_740,auVar119);
          auVar87 = vfmadd213ps_fma(auVar98,auVar116,auVar231);
          auVar114 = vsubps_avx(auVar100,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar99,auVar116,auVar117);
          auVar100 = vsubps_avx512vl(auVar121,ZEXT1632(auVar87));
          auVar87 = vfmadd213ps_fma(auVar112,auVar116,auVar118);
          auVar98 = vsubps_avx512vl(auVar122,ZEXT1632(auVar87));
          auVar243 = ZEXT3264(auVar98);
          auVar207._8_4_ = 0x7f800000;
          auVar207._0_8_ = 0x7f8000007f800000;
          auVar207._12_4_ = 0x7f800000;
          auVar207._16_4_ = 0x7f800000;
          auVar207._20_4_ = 0x7f800000;
          auVar207._24_4_ = 0x7f800000;
          auVar207._28_4_ = 0x7f800000;
          auVar98 = vblendmps_avx512vl(auVar207,auVar120);
          bVar80 = (bool)((byte)uVar78 & 1);
          auVar142._0_4_ = (uint)bVar80 * auVar98._0_4_ | (uint)!bVar80 * auVar85._0_4_;
          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar142._4_4_ = (uint)bVar80 * auVar98._4_4_ | (uint)!bVar80 * auVar85._4_4_;
          bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar142._8_4_ = (uint)bVar80 * auVar98._8_4_ | (uint)!bVar80 * auVar85._8_4_;
          bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar142._12_4_ = (uint)bVar80 * auVar98._12_4_ | (uint)!bVar80 * auVar85._12_4_;
          iVar1 = (uint)((byte)(uVar78 >> 4) & 1) * auVar98._16_4_;
          auVar142._16_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar78 >> 5) & 1) * auVar98._20_4_;
          auVar142._20_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar78 >> 6) & 1) * auVar98._24_4_;
          auVar142._24_4_ = iVar3;
          iVar4 = (uint)(byte)(uVar78 >> 7) * auVar98._28_4_;
          auVar142._28_4_ = iVar4;
          auVar208._8_4_ = 0xff800000;
          auVar208._0_8_ = 0xff800000ff800000;
          auVar208._12_4_ = 0xff800000;
          auVar208._16_4_ = 0xff800000;
          auVar208._20_4_ = 0xff800000;
          auVar208._24_4_ = 0xff800000;
          auVar208._28_4_ = 0xff800000;
          auVar98 = vblendmps_avx512vl(auVar208,auVar119);
          bVar80 = (bool)((byte)uVar78 & 1);
          auVar143._0_4_ = (uint)bVar80 * auVar98._0_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
          auVar143._4_4_ = (uint)bVar80 * auVar98._4_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
          auVar143._8_4_ = (uint)bVar80 * auVar98._8_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
          auVar143._12_4_ = (uint)bVar80 * auVar98._12_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
          auVar143._16_4_ = (uint)bVar80 * auVar98._16_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
          auVar143._20_4_ = (uint)bVar80 * auVar98._20_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
          auVar143._24_4_ = (uint)bVar80 * auVar98._24_4_ | (uint)!bVar80 * -0x800000;
          bVar80 = SUB81(uVar78 >> 7,0);
          auVar143._28_4_ = (uint)bVar80 * auVar98._28_4_ | (uint)!bVar80 * -0x800000;
          auVar39._8_4_ = 0x36000000;
          auVar39._0_8_ = 0x3600000036000000;
          auVar39._12_4_ = 0x36000000;
          auVar39._16_4_ = 0x36000000;
          auVar39._20_4_ = 0x36000000;
          auVar39._24_4_ = 0x36000000;
          auVar39._28_4_ = 0x36000000;
          auVar98 = vmulps_avx512vl(local_7c0,auVar39);
          uVar25 = vcmpps_avx512vl(auVar98,local_7e0,0xe);
          uVar78 = uVar78 & uVar25;
          bVar75 = (byte)uVar78;
          if (bVar75 != 0) {
            uVar25 = vcmpps_avx512vl(auVar111,ZEXT1632(auVar88),2);
            auVar249._8_4_ = 0x7f800000;
            auVar249._0_8_ = 0x7f8000007f800000;
            auVar249._12_4_ = 0x7f800000;
            auVar249._16_4_ = 0x7f800000;
            auVar249._20_4_ = 0x7f800000;
            auVar249._24_4_ = 0x7f800000;
            auVar249._28_4_ = 0x7f800000;
            auVar255._8_4_ = 0xff800000;
            auVar255._0_8_ = 0xff800000ff800000;
            auVar255._12_4_ = 0xff800000;
            auVar255._16_4_ = 0xff800000;
            auVar255._20_4_ = 0xff800000;
            auVar255._24_4_ = 0xff800000;
            auVar255._28_4_ = 0xff800000;
            auVar111 = vblendmps_avx512vl(auVar249,auVar255);
            bVar72 = (byte)uVar25;
            uVar83 = (uint)(bVar72 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar72 & 1) * auVar98._0_4_
            ;
            bVar80 = (bool)((byte)(uVar25 >> 1) & 1);
            uVar147 = (uint)bVar80 * auVar111._4_4_ | (uint)!bVar80 * auVar98._4_4_;
            bVar80 = (bool)((byte)(uVar25 >> 2) & 1);
            uVar148 = (uint)bVar80 * auVar111._8_4_ | (uint)!bVar80 * auVar98._8_4_;
            bVar80 = (bool)((byte)(uVar25 >> 3) & 1);
            uVar149 = (uint)bVar80 * auVar111._12_4_ | (uint)!bVar80 * auVar98._12_4_;
            bVar80 = (bool)((byte)(uVar25 >> 4) & 1);
            uVar150 = (uint)bVar80 * auVar111._16_4_ | (uint)!bVar80 * auVar98._16_4_;
            bVar80 = (bool)((byte)(uVar25 >> 5) & 1);
            uVar151 = (uint)bVar80 * auVar111._20_4_ | (uint)!bVar80 * auVar98._20_4_;
            bVar80 = (bool)((byte)(uVar25 >> 6) & 1);
            uVar152 = (uint)bVar80 * auVar111._24_4_ | (uint)!bVar80 * auVar98._24_4_;
            bVar80 = SUB81(uVar25 >> 7,0);
            uVar153 = (uint)bVar80 * auVar111._28_4_ | (uint)!bVar80 * auVar98._28_4_;
            auVar142._0_4_ = (bVar75 & 1) * uVar83 | !(bool)(bVar75 & 1) * auVar142._0_4_;
            bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar142._4_4_ = bVar80 * uVar147 | !bVar80 * auVar142._4_4_;
            bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar142._8_4_ = bVar80 * uVar148 | !bVar80 * auVar142._8_4_;
            bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar142._12_4_ = bVar80 * uVar149 | !bVar80 * auVar142._12_4_;
            bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar142._16_4_ = bVar80 * uVar150 | (uint)!bVar80 * iVar1;
            bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar142._20_4_ = bVar80 * uVar151 | (uint)!bVar80 * iVar2;
            bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar142._24_4_ = bVar80 * uVar152 | (uint)!bVar80 * iVar3;
            bVar80 = SUB81(uVar78 >> 7,0);
            auVar142._28_4_ = bVar80 * uVar153 | (uint)!bVar80 * iVar4;
            auVar111 = vblendmps_avx512vl(auVar255,auVar249);
            bVar80 = (bool)((byte)(uVar25 >> 1) & 1);
            bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
            bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar25 >> 4) & 1);
            bVar14 = (bool)((byte)(uVar25 >> 5) & 1);
            bVar15 = (bool)((byte)(uVar25 >> 6) & 1);
            bVar16 = SUB81(uVar25 >> 7,0);
            auVar143._0_4_ =
                 (uint)(bVar75 & 1) *
                 ((uint)(bVar72 & 1) * auVar111._0_4_ | !(bool)(bVar72 & 1) * uVar83) |
                 !(bool)(bVar75 & 1) * auVar143._0_4_;
            bVar10 = (bool)((byte)(uVar78 >> 1) & 1);
            auVar143._4_4_ =
                 (uint)bVar10 * ((uint)bVar80 * auVar111._4_4_ | !bVar80 * uVar147) |
                 !bVar10 * auVar143._4_4_;
            bVar80 = (bool)((byte)(uVar78 >> 2) & 1);
            auVar143._8_4_ =
                 (uint)bVar80 * ((uint)bVar11 * auVar111._8_4_ | !bVar11 * uVar148) |
                 !bVar80 * auVar143._8_4_;
            bVar80 = (bool)((byte)(uVar78 >> 3) & 1);
            auVar143._12_4_ =
                 (uint)bVar80 * ((uint)bVar12 * auVar111._12_4_ | !bVar12 * uVar149) |
                 !bVar80 * auVar143._12_4_;
            bVar80 = (bool)((byte)(uVar78 >> 4) & 1);
            auVar143._16_4_ =
                 (uint)bVar80 * ((uint)bVar13 * auVar111._16_4_ | !bVar13 * uVar150) |
                 !bVar80 * auVar143._16_4_;
            bVar80 = (bool)((byte)(uVar78 >> 5) & 1);
            auVar143._20_4_ =
                 (uint)bVar80 * ((uint)bVar14 * auVar111._20_4_ | !bVar14 * uVar151) |
                 !bVar80 * auVar143._20_4_;
            bVar80 = (bool)((byte)(uVar78 >> 6) & 1);
            auVar143._24_4_ =
                 (uint)bVar80 * ((uint)bVar15 * auVar111._24_4_ | !bVar15 * uVar152) |
                 !bVar80 * auVar143._24_4_;
            bVar80 = SUB81(uVar78 >> 7,0);
            auVar143._28_4_ =
                 (uint)bVar80 * ((uint)bVar16 * auVar111._28_4_ | !bVar16 * uVar153) |
                 !bVar80 * auVar143._28_4_;
            bVar77 = (~bVar75 | bVar72) & bVar77;
          }
        }
        auVar248._0_4_ = (float)local_740._0_4_ * auVar243._0_4_;
        auVar248._4_4_ = (float)local_740._4_4_ * auVar243._4_4_;
        auVar248._8_4_ = fStack_738 * auVar243._8_4_;
        auVar248._12_4_ = fStack_734 * auVar243._12_4_;
        auVar248._16_4_ = fStack_730 * auVar243._16_4_;
        auVar248._20_4_ = fStack_72c * auVar243._20_4_;
        auVar248._28_36_ = auVar243._28_36_;
        auVar248._24_4_ = fStack_728 * auVar243._24_4_;
        auVar87 = vfmadd231ps_fma(auVar248._0_32_,local_720,auVar100);
        auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),local_700,auVar114);
        _local_540 = local_6e0;
        local_520 = vminps_avx(local_5e0,auVar142);
        auVar246._8_4_ = 0x7fffffff;
        auVar246._0_8_ = 0x7fffffff7fffffff;
        auVar246._12_4_ = 0x7fffffff;
        auVar246._16_4_ = 0x7fffffff;
        auVar246._20_4_ = 0x7fffffff;
        auVar246._24_4_ = 0x7fffffff;
        auVar246._28_4_ = 0x7fffffff;
        auVar111 = vandps_avx(ZEXT1632(auVar87),auVar246);
        _local_680 = vmaxps_avx(local_6e0,auVar143);
        auVar247._8_4_ = 0x3e99999a;
        auVar247._0_8_ = 0x3e99999a3e99999a;
        auVar247._12_4_ = 0x3e99999a;
        auVar247._16_4_ = 0x3e99999a;
        auVar247._20_4_ = 0x3e99999a;
        auVar247._24_4_ = 0x3e99999a;
        auVar247._28_4_ = 0x3e99999a;
        uVar24 = vcmpps_avx512vl(auVar111,auVar247,1);
        uVar27 = vcmpps_avx512vl(local_6e0,local_520,2);
        bVar75 = (byte)uVar27 & bVar71;
        uVar26 = vcmpps_avx512vl(_local_680,local_5e0,2);
        if ((bVar71 & ((byte)uVar26 | (byte)uVar27)) == 0) {
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar263 = ZEXT3264(auVar111);
          auVar168 = ZEXT3264(_DAT_01f7b040);
          auVar251 = ZEXT3264(local_a20);
          auVar256 = ZEXT3264(local_a40);
          auVar258 = ZEXT3264(local_a60);
          auVar248 = ZEXT3264(local_9c0);
          auVar243 = ZEXT3264(local_9e0);
          auVar250 = ZEXT3264(local_a00);
          auVar253 = ZEXT3264(local_a80);
        }
        else {
          bVar72 = (byte)uVar24 | ~bVar77;
          auVar55._4_4_ = (float)local_740._4_4_ * auVar252._4_4_;
          auVar55._0_4_ = (float)local_740._0_4_ * auVar252._0_4_;
          auVar55._8_4_ = fStack_738 * auVar252._8_4_;
          auVar55._12_4_ = fStack_734 * auVar252._12_4_;
          auVar55._16_4_ = fStack_730 * auVar252._16_4_;
          auVar55._20_4_ = fStack_72c * auVar252._20_4_;
          auVar55._24_4_ = fStack_728 * auVar252._24_4_;
          auVar55._28_4_ = local_680._28_4_;
          auVar87 = vfmadd213ps_fma(auVar115,local_720,auVar55);
          auVar87 = vfmadd213ps_fma(auVar113,local_700,ZEXT1632(auVar87));
          auVar111 = vandps_avx(ZEXT1632(auVar87),auVar246);
          uVar24 = vcmpps_avx512vl(auVar111,auVar247,1);
          bVar77 = (byte)uVar24 | ~bVar77;
          auVar162._8_4_ = 2;
          auVar162._0_8_ = 0x200000002;
          auVar162._12_4_ = 2;
          auVar162._16_4_ = 2;
          auVar162._20_4_ = 2;
          auVar162._24_4_ = 2;
          auVar162._28_4_ = 2;
          auVar40._8_4_ = 3;
          auVar40._0_8_ = 0x300000003;
          auVar40._12_4_ = 3;
          auVar40._16_4_ = 3;
          auVar40._20_4_ = 3;
          auVar40._24_4_ = 3;
          auVar40._28_4_ = 3;
          auVar111 = vpblendmd_avx512vl(auVar162,auVar40);
          local_5c0._0_4_ = (uint)(bVar77 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar77 & 1) * 2;
          bVar80 = (bool)(bVar77 >> 1 & 1);
          local_5c0._4_4_ = (uint)bVar80 * auVar111._4_4_ | (uint)!bVar80 * 2;
          bVar80 = (bool)(bVar77 >> 2 & 1);
          local_5c0._8_4_ = (uint)bVar80 * auVar111._8_4_ | (uint)!bVar80 * 2;
          bVar80 = (bool)(bVar77 >> 3 & 1);
          local_5c0._12_4_ = (uint)bVar80 * auVar111._12_4_ | (uint)!bVar80 * 2;
          bVar80 = (bool)(bVar77 >> 4 & 1);
          local_5c0._16_4_ = (uint)bVar80 * auVar111._16_4_ | (uint)!bVar80 * 2;
          bVar80 = (bool)(bVar77 >> 5 & 1);
          local_5c0._20_4_ = (uint)bVar80 * auVar111._20_4_ | (uint)!bVar80 * 2;
          bVar80 = (bool)(bVar77 >> 6 & 1);
          local_5c0._24_4_ = (uint)bVar80 * auVar111._24_4_ | (uint)!bVar80 * 2;
          local_5c0._28_4_ = (uint)(bVar77 >> 7) * auVar111._28_4_ | (uint)!(bool)(bVar77 >> 7) * 2;
          local_620 = vpbroadcastd_avx512vl();
          uVar24 = vpcmpd_avx512vl(local_620,local_5c0,5);
          local_660 = local_6e0._0_4_ + (float)local_960._0_4_;
          fStack_65c = local_6e0._4_4_ + (float)local_960._4_4_;
          fStack_658 = local_6e0._8_4_ + fStack_958;
          fStack_654 = local_6e0._12_4_ + fStack_954;
          fStack_650 = local_6e0._16_4_ + fStack_950;
          fStack_64c = local_6e0._20_4_ + fStack_94c;
          fStack_648 = local_6e0._24_4_ + fStack_948;
          fStack_644 = local_6e0._28_4_ + fStack_944;
          _local_600 = _local_680;
          for (bVar77 = (byte)uVar24 & bVar75; bVar77 != 0;
              bVar77 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar77 & (byte)uVar24) {
            auVar163._8_4_ = 0x7f800000;
            auVar163._0_8_ = 0x7f8000007f800000;
            auVar163._12_4_ = 0x7f800000;
            auVar163._16_4_ = 0x7f800000;
            auVar163._20_4_ = 0x7f800000;
            auVar163._24_4_ = 0x7f800000;
            auVar163._28_4_ = 0x7f800000;
            auVar111 = vblendmps_avx512vl(auVar163,local_6e0);
            auVar144._0_4_ =
                 (uint)(bVar77 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 1 & 1);
            auVar144._4_4_ = (uint)bVar80 * auVar111._4_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 2 & 1);
            auVar144._8_4_ = (uint)bVar80 * auVar111._8_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 3 & 1);
            auVar144._12_4_ = (uint)bVar80 * auVar111._12_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 4 & 1);
            auVar144._16_4_ = (uint)bVar80 * auVar111._16_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 5 & 1);
            auVar144._20_4_ = (uint)bVar80 * auVar111._20_4_ | (uint)!bVar80 * 0x7f800000;
            auVar144._24_4_ =
                 (uint)(bVar77 >> 6) * auVar111._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
            auVar144._28_4_ = 0x7f800000;
            auVar111 = vshufps_avx(auVar144,auVar144,0xb1);
            auVar111 = vminps_avx(auVar144,auVar111);
            auVar100 = vshufpd_avx(auVar111,auVar111,5);
            auVar111 = vminps_avx(auVar111,auVar100);
            auVar100 = vpermpd_avx2(auVar111,0x4e);
            auVar111 = vminps_avx(auVar111,auVar100);
            uVar24 = vcmpps_avx512vl(auVar144,auVar111,0);
            bVar73 = (byte)uVar24 & bVar77;
            bVar74 = bVar77;
            if (bVar73 != 0) {
              bVar74 = bVar73;
            }
            iVar2 = 0;
            for (uVar83 = (uint)bVar74; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar83 = *(uint *)(local_4e0 + (uint)(iVar2 << 2));
            fVar154 = auVar23._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
            if ((float)local_9a0._0_4_ < 0.0) {
              local_ac0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar2 << 2)));
              auVar261 = ZEXT1664(auVar261._0_16_);
              fVar154 = sqrtf((float)local_9a0._0_4_);
              auVar87 = local_ac0._0_16_;
            }
            auVar84 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar88 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar97 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar89 = vminps_avx(auVar84,auVar97);
            auVar84 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar97 = vmaxps_avx(auVar88,auVar84);
            auVar212._8_4_ = 0x7fffffff;
            auVar212._0_8_ = 0x7fffffff7fffffff;
            auVar212._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx(auVar89,auVar212);
            auVar84 = vandps_avx(auVar97,auVar212);
            auVar88 = vmaxps_avx(auVar88,auVar84);
            auVar84 = vmovshdup_avx(auVar88);
            auVar84 = vmaxss_avx(auVar84,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar84);
            fVar181 = auVar88._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar97,auVar97,0xff);
            auVar87 = vinsertps_avx(auVar87,ZEXT416(uVar83),0x10);
            auVar168 = ZEXT1664(auVar87);
            lVar79 = 5;
            do {
              do {
                bVar80 = lVar79 == 0;
                lVar79 = lVar79 + -1;
                if (bVar80) goto LAB_01a7fdc6;
                uVar170 = auVar168._0_4_;
                auVar156._4_4_ = uVar170;
                auVar156._0_4_ = uVar170;
                auVar156._8_4_ = uVar170;
                auVar156._12_4_ = uVar170;
                auVar88 = vfmadd132ps_fma(auVar156,ZEXT816(0) << 0x40,local_990);
                auVar84 = auVar168._0_16_;
                auVar87 = vmovshdup_avx(auVar84);
                local_880._0_16_ = auVar87;
                fVar189 = 1.0 - auVar87._0_4_;
                auVar87 = vshufps_avx(auVar84,auVar84,0x55);
                fVar183 = auVar87._0_4_;
                auVar192._0_4_ = local_840._0_4_ * fVar183;
                fVar185 = auVar87._4_4_;
                auVar192._4_4_ = local_840._4_4_ * fVar185;
                fVar155 = auVar87._8_4_;
                auVar192._8_4_ = local_840._8_4_ * fVar155;
                fVar187 = auVar87._12_4_;
                auVar192._12_4_ = local_840._12_4_ * fVar187;
                _local_780 = ZEXT416((uint)fVar189);
                auVar213._4_4_ = fVar189;
                auVar213._0_4_ = fVar189;
                auVar213._8_4_ = fVar189;
                auVar213._12_4_ = fVar189;
                auVar87 = vfmadd231ps_fma(auVar192,auVar213,local_800._0_16_);
                auVar227._0_4_ = local_820._0_4_ * fVar183;
                auVar227._4_4_ = local_820._4_4_ * fVar185;
                auVar227._8_4_ = local_820._8_4_ * fVar155;
                auVar227._12_4_ = local_820._12_4_ * fVar187;
                auVar84 = vfmadd231ps_fma(auVar227,auVar213,local_840._0_16_);
                auVar233._0_4_ = fVar183 * (float)local_860._0_4_;
                auVar233._4_4_ = fVar185 * (float)local_860._4_4_;
                auVar233._8_4_ = fVar155 * fStack_858;
                auVar233._12_4_ = fVar187 * fStack_854;
                auVar97 = vfmadd231ps_fma(auVar233,auVar213,local_820._0_16_);
                auVar240._0_4_ = fVar183 * auVar84._0_4_;
                auVar240._4_4_ = fVar185 * auVar84._4_4_;
                auVar240._8_4_ = fVar155 * auVar84._8_4_;
                auVar240._12_4_ = fVar187 * auVar84._12_4_;
                auVar87 = vfmadd231ps_fma(auVar240,auVar213,auVar87);
                auVar193._0_4_ = fVar183 * auVar97._0_4_;
                auVar193._4_4_ = fVar185 * auVar97._4_4_;
                auVar193._8_4_ = fVar155 * auVar97._8_4_;
                auVar193._12_4_ = fVar187 * auVar97._12_4_;
                auVar84 = vfmadd231ps_fma(auVar193,auVar213,auVar84);
                auVar228._0_4_ = fVar183 * auVar84._0_4_;
                auVar228._4_4_ = fVar185 * auVar84._4_4_;
                auVar228._8_4_ = fVar155 * auVar84._8_4_;
                auVar228._12_4_ = fVar187 * auVar84._12_4_;
                auVar97 = vfmadd231ps_fma(auVar228,auVar87,auVar213);
                auVar87 = vsubps_avx(auVar84,auVar87);
                auVar28._8_4_ = 0x40400000;
                auVar28._0_8_ = 0x4040000040400000;
                auVar28._12_4_ = 0x40400000;
                auVar84 = vmulps_avx512vl(auVar87,auVar28);
                local_760._0_16_ = auVar97;
                auVar88 = vsubps_avx(auVar88,auVar97);
                auVar87 = vdpps_avx(auVar88,auVar88,0x7f);
                local_ac0._0_16_ = auVar87;
                local_8c0 = auVar168;
                if (auVar87._0_4_ < 0.0) {
                  auVar251._0_4_ = sqrtf(auVar87._0_4_);
                  auVar251._4_60_ = extraout_var;
                  auVar87 = auVar251._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                }
                local_7a0._0_16_ = vdpps_avx(auVar84,auVar84,0x7f);
                fVar183 = local_7a0._0_4_;
                auVar194._4_12_ = ZEXT812(0) << 0x20;
                auVar194._0_4_ = fVar183;
                local_940._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
                fVar185 = local_940._0_4_;
                local_7c0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
                auVar29._8_4_ = 0x80000000;
                auVar29._0_8_ = 0x8000000080000000;
                auVar29._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(local_7a0._0_16_,auVar29);
                auVar97 = vfnmadd213ss_fma(local_7c0._0_16_,local_7a0._0_16_,ZEXT416(0x40000000));
                local_7e0._0_4_ = auVar97._0_4_;
                local_980._0_4_ = auVar87._0_4_;
                if (fVar183 < auVar89._0_4_) {
                  fVar155 = sqrtf(fVar183);
                  auVar87 = ZEXT416((uint)local_980._0_4_);
                }
                else {
                  auVar97 = vsqrtss_avx(local_7a0._0_16_,local_7a0._0_16_);
                  fVar155 = auVar97._0_4_;
                }
                fVar187 = local_940._0_4_;
                fVar183 = fVar185 * 1.5 + fVar183 * -0.5 * fVar187 * fVar187 * fVar187;
                local_940._0_4_ = auVar84._0_4_ * fVar183;
                local_940._4_4_ = auVar84._4_4_ * fVar183;
                local_940._8_4_ = auVar84._8_4_ * fVar183;
                local_940._12_4_ = auVar84._12_4_ * fVar183;
                auVar97 = vdpps_avx(auVar88,local_940._0_16_,0x7f);
                fVar189 = auVar87._0_4_;
                fVar185 = auVar97._0_4_;
                auVar157._0_4_ = fVar185 * fVar185;
                auVar157._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                auVar157._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                auVar157._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                auVar89 = vsubps_avx(local_ac0._0_16_,auVar157);
                fVar187 = auVar89._0_4_;
                auVar171._4_12_ = ZEXT812(0) << 0x20;
                auVar171._0_4_ = fVar187;
                auVar85 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar171);
                auVar90 = vmulss_avx512f(auVar85,ZEXT416(0x3fc00000));
                auVar91 = vmulss_avx512f(auVar89,ZEXT416(0xbf000000));
                if (fVar187 < 0.0) {
                  local_8d0._0_4_ = fVar155;
                  local_8f0._0_4_ = auVar90._0_4_;
                  local_900._4_4_ = fVar183;
                  local_900._0_4_ = fVar183;
                  fStack_8f8 = fVar183;
                  fStack_8f4 = fVar183;
                  local_8e0 = auVar85;
                  fVar187 = sqrtf(fVar187);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar90 = ZEXT416((uint)local_8f0._0_4_);
                  auVar87 = ZEXT416((uint)local_980._0_4_);
                  auVar85 = local_8e0;
                  fVar183 = (float)local_900._0_4_;
                  fVar211 = (float)local_900._4_4_;
                  fVar169 = fStack_8f8;
                  fVar182 = fStack_8f4;
                  fVar155 = (float)local_8d0._0_4_;
                }
                else {
                  auVar89 = vsqrtss_avx(auVar89,auVar89);
                  fVar187 = auVar89._0_4_;
                  fVar211 = fVar183;
                  fVar169 = fVar183;
                  fVar182 = fVar183;
                }
                auVar261 = ZEXT1664(auVar97);
                auVar93 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,local_880._0_16_
                                         );
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_880._0_16_,_local_780
                                         );
                fVar184 = auVar89._0_4_ * 6.0;
                fVar186 = local_880._0_4_ * 6.0;
                auVar214._0_4_ = fVar186 * (float)local_860._0_4_;
                auVar214._4_4_ = fVar186 * (float)local_860._4_4_;
                auVar214._8_4_ = fVar186 * fStack_858;
                auVar214._12_4_ = fVar186 * fStack_854;
                auVar195._4_4_ = fVar184;
                auVar195._0_4_ = fVar184;
                auVar195._8_4_ = fVar184;
                auVar195._12_4_ = fVar184;
                auVar89 = vfmadd132ps_fma(auVar195,auVar214,local_820._0_16_);
                fVar184 = auVar93._0_4_ * 6.0;
                auVar172._4_4_ = fVar184;
                auVar172._0_4_ = fVar184;
                auVar172._8_4_ = fVar184;
                auVar172._12_4_ = fVar184;
                auVar89 = vfmadd132ps_fma(auVar172,auVar89,local_840._0_16_);
                fVar184 = local_780._0_4_ * 6.0;
                auVar196._4_4_ = fVar184;
                auVar196._0_4_ = fVar184;
                auVar196._8_4_ = fVar184;
                auVar196._12_4_ = fVar184;
                auVar89 = vfmadd132ps_fma(auVar196,auVar89,local_800._0_16_);
                auVar173._0_4_ = auVar89._0_4_ * (float)local_7a0._0_4_;
                auVar173._4_4_ = auVar89._4_4_ * (float)local_7a0._0_4_;
                auVar173._8_4_ = auVar89._8_4_ * (float)local_7a0._0_4_;
                auVar173._12_4_ = auVar89._12_4_ * (float)local_7a0._0_4_;
                auVar89 = vdpps_avx(auVar84,auVar89,0x7f);
                fVar184 = auVar89._0_4_;
                auVar197._0_4_ = auVar84._0_4_ * fVar184;
                auVar197._4_4_ = auVar84._4_4_ * fVar184;
                auVar197._8_4_ = auVar84._8_4_ * fVar184;
                auVar197._12_4_ = auVar84._12_4_ * fVar184;
                auVar89 = vsubps_avx(auVar173,auVar197);
                fVar184 = (float)local_7e0._0_4_ * (float)local_7c0._0_4_;
                auVar93 = vmaxss_avx(ZEXT416((uint)fVar181),
                                     ZEXT416((uint)(local_8c0._0_4_ * fVar154 * 1.9073486e-06)));
                auVar30._8_4_ = 0x80000000;
                auVar30._0_8_ = 0x8000000080000000;
                auVar30._12_4_ = 0x80000000;
                auVar92 = vxorps_avx512vl(auVar84,auVar30);
                auVar198._0_4_ = fVar183 * auVar89._0_4_ * fVar184;
                auVar198._4_4_ = fVar211 * auVar89._4_4_ * fVar184;
                auVar198._8_4_ = fVar169 * auVar89._8_4_ * fVar184;
                auVar198._12_4_ = fVar182 * auVar89._12_4_ * fVar184;
                auVar89 = vdpps_avx(auVar92,local_940._0_16_,0x7f);
                auVar94 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar181),auVar93);
                auVar87 = vdpps_avx(auVar88,auVar198,0x7f);
                auVar94 = vfmadd213ss_fma(ZEXT416((uint)(fVar189 + 1.0)),
                                          ZEXT416((uint)(fVar181 / fVar155)),auVar94);
                fVar183 = auVar89._0_4_ + auVar87._0_4_;
                auVar87 = vdpps_avx(local_990,local_940._0_16_,0x7f);
                auVar89 = vdpps_avx(auVar88,auVar92,0x7f);
                auVar91 = vmulss_avx512f(auVar91,auVar85);
                auVar85 = vmulss_avx512f(auVar85,auVar85);
                auVar92 = vaddss_avx512f(auVar90,ZEXT416((uint)(auVar91._0_4_ * auVar85._0_4_)));
                auVar85 = vdpps_avx(auVar88,local_990,0x7f);
                auVar91 = vfnmadd231ss_fma(auVar89,auVar97,ZEXT416((uint)fVar183));
                auVar85 = vfnmadd231ss_fma(auVar85,auVar97,auVar87);
                auVar89 = vpermilps_avx(local_760._0_16_,0xff);
                fVar187 = fVar187 - auVar89._0_4_;
                auVar90 = vshufps_avx(auVar84,auVar84,0xff);
                auVar89 = vfmsub213ss_fma(auVar91,auVar92,auVar90);
                auVar244._0_8_ = auVar89._0_8_ ^ 0x8000000080000000;
                auVar244._8_4_ = auVar89._8_4_ ^ 0x80000000;
                auVar244._12_4_ = auVar89._12_4_ ^ 0x80000000;
                auVar85 = ZEXT416((uint)(auVar85._0_4_ * auVar92._0_4_));
                auVar91 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar89._0_4_)),
                                          ZEXT416((uint)fVar183),auVar85);
                auVar89 = vinsertps_avx(auVar244,auVar85,0x1c);
                auVar234._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                auVar234._8_4_ = auVar87._8_4_ ^ 0x80000000;
                auVar234._12_4_ = auVar87._12_4_ ^ 0x80000000;
                auVar85 = vinsertps_avx(ZEXT416((uint)fVar183),auVar234,0x10);
                auVar215._0_4_ = auVar91._0_4_;
                auVar215._4_4_ = auVar215._0_4_;
                auVar215._8_4_ = auVar215._0_4_;
                auVar215._12_4_ = auVar215._0_4_;
                auVar87 = vdivps_avx(auVar89,auVar215);
                auVar89 = vdivps_avx(auVar85,auVar215);
                auVar216._0_4_ = fVar185 * auVar87._0_4_ + fVar187 * auVar89._0_4_;
                auVar216._4_4_ = fVar185 * auVar87._4_4_ + fVar187 * auVar89._4_4_;
                auVar216._8_4_ = fVar185 * auVar87._8_4_ + fVar187 * auVar89._8_4_;
                auVar216._12_4_ = fVar185 * auVar87._12_4_ + fVar187 * auVar89._12_4_;
                auVar87 = vsubps_avx(local_8c0._0_16_,auVar216);
                auVar168 = ZEXT1664(auVar87);
                auVar31._8_4_ = 0x7fffffff;
                auVar31._0_8_ = 0x7fffffff7fffffff;
                auVar31._12_4_ = 0x7fffffff;
                auVar89 = vandps_avx512vl(auVar97,auVar31);
              } while (auVar94._0_4_ <= auVar89._0_4_);
              auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar94._0_4_ + auVar93._0_4_)),local_910,
                                        ZEXT416(0x36000000));
              auVar32._8_4_ = 0x7fffffff;
              auVar32._0_8_ = 0x7fffffff7fffffff;
              auVar32._12_4_ = 0x7fffffff;
              auVar85 = vandps_avx512vl(ZEXT416((uint)fVar187),auVar32);
            } while (auVar89._0_4_ <= auVar85._0_4_);
            fVar154 = auVar87._0_4_ + (float)local_920._0_4_;
            if ((fVar260 <= fVar154) &&
               (fVar181 = *(float *)(ray + k * 4 + 0x200), fVar154 <= fVar181)) {
              auVar87 = vmovshdup_avx(auVar87);
              fVar183 = auVar87._0_4_;
              if ((0.0 <= fVar183) && (fVar183 <= 1.0)) {
                auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_ac0._0_4_));
                fVar185 = auVar87._0_4_;
                pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar185 = fVar185 * 1.5 + local_ac0._0_4_ * -0.5 * fVar185 * fVar185 * fVar185;
                  auVar217._0_4_ = auVar88._0_4_ * fVar185;
                  auVar217._4_4_ = auVar88._4_4_ * fVar185;
                  auVar217._8_4_ = auVar88._8_4_ * fVar185;
                  auVar217._12_4_ = auVar88._12_4_ * fVar185;
                  auVar89 = vfmadd213ps_fma(auVar90,auVar217,auVar84);
                  auVar87 = vshufps_avx(auVar217,auVar217,0xc9);
                  auVar88 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar218._0_4_ = auVar217._0_4_ * auVar88._0_4_;
                  auVar218._4_4_ = auVar217._4_4_ * auVar88._4_4_;
                  auVar218._8_4_ = auVar217._8_4_ * auVar88._8_4_;
                  auVar218._12_4_ = auVar217._12_4_ * auVar88._12_4_;
                  auVar84 = vfmsub231ps_fma(auVar218,auVar84,auVar87);
                  auVar87 = vshufps_avx(auVar84,auVar84,0xc9);
                  auVar88 = vshufps_avx(auVar89,auVar89,0xc9);
                  auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                  auVar158._0_4_ = auVar89._0_4_ * auVar84._0_4_;
                  auVar158._4_4_ = auVar89._4_4_ * auVar84._4_4_;
                  auVar158._8_4_ = auVar89._8_4_ * auVar84._8_4_;
                  auVar158._12_4_ = auVar89._12_4_ * auVar84._12_4_;
                  auVar87 = vfmsub231ps_fma(auVar158,auVar87,auVar88);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar154;
                    uVar170 = vextractps_avx(auVar87,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar170;
                    uVar170 = vextractps_avx(auVar87,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar170;
                    *(int *)(ray + k * 4 + 0x380) = auVar87._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar183;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar6;
                    *(uint *)(ray + k * 4 + 0x480) = uVar5;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar9 = context->user;
                    auVar243 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar243,auVar168);
                    auVar168 = vpermps_avx512f(auVar243,ZEXT1664(auVar87));
                    auVar243 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar243,ZEXT1664(auVar87));
                    local_380 = vbroadcastss_avx512f(auVar87);
                    local_400[0] = (RTCHitN)auVar168[0];
                    local_400[1] = (RTCHitN)auVar168[1];
                    local_400[2] = (RTCHitN)auVar168[2];
                    local_400[3] = (RTCHitN)auVar168[3];
                    local_400[4] = (RTCHitN)auVar168[4];
                    local_400[5] = (RTCHitN)auVar168[5];
                    local_400[6] = (RTCHitN)auVar168[6];
                    local_400[7] = (RTCHitN)auVar168[7];
                    local_400[8] = (RTCHitN)auVar168[8];
                    local_400[9] = (RTCHitN)auVar168[9];
                    local_400[10] = (RTCHitN)auVar168[10];
                    local_400[0xb] = (RTCHitN)auVar168[0xb];
                    local_400[0xc] = (RTCHitN)auVar168[0xc];
                    local_400[0xd] = (RTCHitN)auVar168[0xd];
                    local_400[0xe] = (RTCHitN)auVar168[0xe];
                    local_400[0xf] = (RTCHitN)auVar168[0xf];
                    local_400[0x10] = (RTCHitN)auVar168[0x10];
                    local_400[0x11] = (RTCHitN)auVar168[0x11];
                    local_400[0x12] = (RTCHitN)auVar168[0x12];
                    local_400[0x13] = (RTCHitN)auVar168[0x13];
                    local_400[0x14] = (RTCHitN)auVar168[0x14];
                    local_400[0x15] = (RTCHitN)auVar168[0x15];
                    local_400[0x16] = (RTCHitN)auVar168[0x16];
                    local_400[0x17] = (RTCHitN)auVar168[0x17];
                    local_400[0x18] = (RTCHitN)auVar168[0x18];
                    local_400[0x19] = (RTCHitN)auVar168[0x19];
                    local_400[0x1a] = (RTCHitN)auVar168[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar168[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar168[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar168[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar168[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar168[0x1f];
                    local_400[0x20] = (RTCHitN)auVar168[0x20];
                    local_400[0x21] = (RTCHitN)auVar168[0x21];
                    local_400[0x22] = (RTCHitN)auVar168[0x22];
                    local_400[0x23] = (RTCHitN)auVar168[0x23];
                    local_400[0x24] = (RTCHitN)auVar168[0x24];
                    local_400[0x25] = (RTCHitN)auVar168[0x25];
                    local_400[0x26] = (RTCHitN)auVar168[0x26];
                    local_400[0x27] = (RTCHitN)auVar168[0x27];
                    local_400[0x28] = (RTCHitN)auVar168[0x28];
                    local_400[0x29] = (RTCHitN)auVar168[0x29];
                    local_400[0x2a] = (RTCHitN)auVar168[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar168[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar168[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar168[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar168[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar168[0x2f];
                    local_400[0x30] = (RTCHitN)auVar168[0x30];
                    local_400[0x31] = (RTCHitN)auVar168[0x31];
                    local_400[0x32] = (RTCHitN)auVar168[0x32];
                    local_400[0x33] = (RTCHitN)auVar168[0x33];
                    local_400[0x34] = (RTCHitN)auVar168[0x34];
                    local_400[0x35] = (RTCHitN)auVar168[0x35];
                    local_400[0x36] = (RTCHitN)auVar168[0x36];
                    local_400[0x37] = (RTCHitN)auVar168[0x37];
                    local_400[0x38] = (RTCHitN)auVar168[0x38];
                    local_400[0x39] = (RTCHitN)auVar168[0x39];
                    local_400[0x3a] = (RTCHitN)auVar168[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar168[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar168[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar168[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar168[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar168[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar168 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar168);
                    auVar111 = vpcmpeqd_avx2(auVar168._0_32_,auVar168._0_32_);
                    local_a98[3] = auVar111;
                    local_a98[2] = auVar111;
                    local_a98[1] = auVar111;
                    *local_a98 = auVar111;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar154;
                    auVar168 = vmovdqa64_avx512f(local_4c0);
                    local_6c0 = vmovdqa64_avx512f(auVar168);
                    local_af0.valid = (int *)local_6c0;
                    local_af0.geometryUserPtr = pGVar7->userPtr;
                    local_af0.context = context->user;
                    local_af0.hit = local_400;
                    local_af0.N = 0x10;
                    local_8c0._0_4_ = fVar181;
                    local_af0.ray = (RTCRayN *)ray;
                    if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar261 = ZEXT1664(auVar97);
                      (*pGVar7->intersectionFilterN)(&local_af0);
                      auVar168 = vmovdqa64_avx512f(local_6c0);
                      fVar181 = (float)local_8c0._0_4_;
                    }
                    uVar24 = vptestmd_avx512f(auVar168,auVar168);
                    if ((short)uVar24 != 0) {
                      p_Var8 = context->args->filter;
                      if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        (*p_Var8)(&local_af0);
                        auVar168 = vmovdqa64_avx512f(local_6c0);
                        fVar181 = (float)local_8c0._0_4_;
                      }
                      uVar78 = vptestmd_avx512f(auVar168,auVar168);
                      if ((short)uVar78 != 0) {
                        iVar3 = *(int *)(local_af0.hit + 4);
                        iVar4 = *(int *)(local_af0.hit + 8);
                        iVar1 = *(int *)(local_af0.hit + 0xc);
                        iVar56 = *(int *)(local_af0.hit + 0x10);
                        iVar57 = *(int *)(local_af0.hit + 0x14);
                        iVar58 = *(int *)(local_af0.hit + 0x18);
                        iVar59 = *(int *)(local_af0.hit + 0x1c);
                        iVar60 = *(int *)(local_af0.hit + 0x20);
                        iVar61 = *(int *)(local_af0.hit + 0x24);
                        iVar62 = *(int *)(local_af0.hit + 0x28);
                        iVar63 = *(int *)(local_af0.hit + 0x2c);
                        iVar64 = *(int *)(local_af0.hit + 0x30);
                        iVar65 = *(int *)(local_af0.hit + 0x34);
                        iVar66 = *(int *)(local_af0.hit + 0x38);
                        iVar67 = *(int *)(local_af0.hit + 0x3c);
                        bVar74 = (byte)uVar78;
                        bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                        bVar73 = (byte)(uVar78 >> 8);
                        bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                        bVar22 = SUB81(uVar78 >> 0xf,0);
                        *(uint *)(local_af0.ray + 0x300) =
                             (uint)(bVar74 & 1) * *(int *)local_af0.hit |
                             (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x300);
                        *(uint *)(local_af0.ray + 0x304) =
                             (uint)bVar80 * iVar3 | (uint)!bVar80 * *(int *)(local_af0.ray + 0x304);
                        *(uint *)(local_af0.ray + 0x308) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_af0.ray + 0x308);
                        *(uint *)(local_af0.ray + 0x30c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_af0.ray + 0x30c);
                        *(uint *)(local_af0.ray + 0x310) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_af0.ray + 0x310)
                        ;
                        *(uint *)(local_af0.ray + 0x314) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_af0.ray + 0x314)
                        ;
                        *(uint *)(local_af0.ray + 0x318) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_af0.ray + 0x318)
                        ;
                        *(uint *)(local_af0.ray + 0x31c) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_af0.ray + 0x31c)
                        ;
                        *(uint *)(local_af0.ray + 800) =
                             (uint)(bVar73 & 1) * iVar60 |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 800);
                        *(uint *)(local_af0.ray + 0x324) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_af0.ray + 0x324)
                        ;
                        *(uint *)(local_af0.ray + 0x328) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_af0.ray + 0x328)
                        ;
                        *(uint *)(local_af0.ray + 0x32c) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_af0.ray + 0x32c)
                        ;
                        *(uint *)(local_af0.ray + 0x330) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_af0.ray + 0x330)
                        ;
                        *(uint *)(local_af0.ray + 0x334) =
                             (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_af0.ray + 0x334)
                        ;
                        *(uint *)(local_af0.ray + 0x338) =
                             (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_af0.ray + 0x338)
                        ;
                        *(uint *)(local_af0.ray + 0x33c) =
                             (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_af0.ray + 0x33c)
                        ;
                        iVar3 = *(int *)(local_af0.hit + 0x44);
                        iVar4 = *(int *)(local_af0.hit + 0x48);
                        iVar1 = *(int *)(local_af0.hit + 0x4c);
                        iVar56 = *(int *)(local_af0.hit + 0x50);
                        iVar57 = *(int *)(local_af0.hit + 0x54);
                        iVar58 = *(int *)(local_af0.hit + 0x58);
                        iVar59 = *(int *)(local_af0.hit + 0x5c);
                        iVar60 = *(int *)(local_af0.hit + 0x60);
                        iVar61 = *(int *)(local_af0.hit + 100);
                        iVar62 = *(int *)(local_af0.hit + 0x68);
                        iVar63 = *(int *)(local_af0.hit + 0x6c);
                        iVar64 = *(int *)(local_af0.hit + 0x70);
                        iVar65 = *(int *)(local_af0.hit + 0x74);
                        iVar66 = *(int *)(local_af0.hit + 0x78);
                        iVar67 = *(int *)(local_af0.hit + 0x7c);
                        bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                        bVar22 = SUB81(uVar78 >> 0xf,0);
                        *(uint *)(local_af0.ray + 0x340) =
                             (uint)(bVar74 & 1) * *(int *)(local_af0.hit + 0x40) |
                             (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x340);
                        *(uint *)(local_af0.ray + 0x344) =
                             (uint)bVar80 * iVar3 | (uint)!bVar80 * *(int *)(local_af0.ray + 0x344);
                        *(uint *)(local_af0.ray + 0x348) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_af0.ray + 0x348);
                        *(uint *)(local_af0.ray + 0x34c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_af0.ray + 0x34c);
                        *(uint *)(local_af0.ray + 0x350) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_af0.ray + 0x350)
                        ;
                        *(uint *)(local_af0.ray + 0x354) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_af0.ray + 0x354)
                        ;
                        *(uint *)(local_af0.ray + 0x358) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_af0.ray + 0x358)
                        ;
                        *(uint *)(local_af0.ray + 0x35c) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_af0.ray + 0x35c)
                        ;
                        *(uint *)(local_af0.ray + 0x360) =
                             (uint)(bVar73 & 1) * iVar60 |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x360);
                        *(uint *)(local_af0.ray + 0x364) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_af0.ray + 0x364)
                        ;
                        *(uint *)(local_af0.ray + 0x368) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_af0.ray + 0x368)
                        ;
                        *(uint *)(local_af0.ray + 0x36c) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_af0.ray + 0x36c)
                        ;
                        *(uint *)(local_af0.ray + 0x370) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_af0.ray + 0x370)
                        ;
                        *(uint *)(local_af0.ray + 0x374) =
                             (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_af0.ray + 0x374)
                        ;
                        *(uint *)(local_af0.ray + 0x378) =
                             (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_af0.ray + 0x378)
                        ;
                        *(uint *)(local_af0.ray + 0x37c) =
                             (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_af0.ray + 0x37c)
                        ;
                        iVar3 = *(int *)(local_af0.hit + 0x84);
                        iVar4 = *(int *)(local_af0.hit + 0x88);
                        iVar1 = *(int *)(local_af0.hit + 0x8c);
                        iVar56 = *(int *)(local_af0.hit + 0x90);
                        iVar57 = *(int *)(local_af0.hit + 0x94);
                        iVar58 = *(int *)(local_af0.hit + 0x98);
                        iVar59 = *(int *)(local_af0.hit + 0x9c);
                        iVar60 = *(int *)(local_af0.hit + 0xa0);
                        iVar61 = *(int *)(local_af0.hit + 0xa4);
                        iVar62 = *(int *)(local_af0.hit + 0xa8);
                        iVar63 = *(int *)(local_af0.hit + 0xac);
                        iVar64 = *(int *)(local_af0.hit + 0xb0);
                        iVar65 = *(int *)(local_af0.hit + 0xb4);
                        iVar66 = *(int *)(local_af0.hit + 0xb8);
                        iVar67 = *(int *)(local_af0.hit + 0xbc);
                        bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                        bVar22 = SUB81(uVar78 >> 0xf,0);
                        *(uint *)(local_af0.ray + 0x380) =
                             (uint)(bVar74 & 1) * *(int *)(local_af0.hit + 0x80) |
                             (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x380);
                        *(uint *)(local_af0.ray + 900) =
                             (uint)bVar80 * iVar3 | (uint)!bVar80 * *(int *)(local_af0.ray + 900);
                        *(uint *)(local_af0.ray + 0x388) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_af0.ray + 0x388);
                        *(uint *)(local_af0.ray + 0x38c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_af0.ray + 0x38c);
                        *(uint *)(local_af0.ray + 0x390) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_af0.ray + 0x390)
                        ;
                        *(uint *)(local_af0.ray + 0x394) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_af0.ray + 0x394)
                        ;
                        *(uint *)(local_af0.ray + 0x398) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_af0.ray + 0x398)
                        ;
                        *(uint *)(local_af0.ray + 0x39c) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_af0.ray + 0x39c)
                        ;
                        *(uint *)(local_af0.ray + 0x3a0) =
                             (uint)(bVar73 & 1) * iVar60 |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x3a0);
                        *(uint *)(local_af0.ray + 0x3a4) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_af0.ray + 0x3a4)
                        ;
                        *(uint *)(local_af0.ray + 0x3a8) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_af0.ray + 0x3a8)
                        ;
                        *(uint *)(local_af0.ray + 0x3ac) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_af0.ray + 0x3ac)
                        ;
                        *(uint *)(local_af0.ray + 0x3b0) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_af0.ray + 0x3b0)
                        ;
                        *(uint *)(local_af0.ray + 0x3b4) =
                             (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_af0.ray + 0x3b4)
                        ;
                        *(uint *)(local_af0.ray + 0x3b8) =
                             (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_af0.ray + 0x3b8)
                        ;
                        *(uint *)(local_af0.ray + 0x3bc) =
                             (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_af0.ray + 0x3bc)
                        ;
                        iVar3 = *(int *)(local_af0.hit + 0xc4);
                        iVar4 = *(int *)(local_af0.hit + 200);
                        iVar1 = *(int *)(local_af0.hit + 0xcc);
                        iVar56 = *(int *)(local_af0.hit + 0xd0);
                        iVar57 = *(int *)(local_af0.hit + 0xd4);
                        iVar58 = *(int *)(local_af0.hit + 0xd8);
                        iVar59 = *(int *)(local_af0.hit + 0xdc);
                        iVar60 = *(int *)(local_af0.hit + 0xe0);
                        iVar61 = *(int *)(local_af0.hit + 0xe4);
                        iVar62 = *(int *)(local_af0.hit + 0xe8);
                        iVar63 = *(int *)(local_af0.hit + 0xec);
                        iVar64 = *(int *)(local_af0.hit + 0xf0);
                        iVar65 = *(int *)(local_af0.hit + 0xf4);
                        iVar66 = *(int *)(local_af0.hit + 0xf8);
                        iVar67 = *(int *)(local_af0.hit + 0xfc);
                        bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                        bVar22 = SUB81(uVar78 >> 0xf,0);
                        *(uint *)(local_af0.ray + 0x3c0) =
                             (uint)(bVar74 & 1) * *(int *)(local_af0.hit + 0xc0) |
                             (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x3c0);
                        *(uint *)(local_af0.ray + 0x3c4) =
                             (uint)bVar80 * iVar3 | (uint)!bVar80 * *(int *)(local_af0.ray + 0x3c4);
                        *(uint *)(local_af0.ray + 0x3c8) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_af0.ray + 0x3c8);
                        *(uint *)(local_af0.ray + 0x3cc) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_af0.ray + 0x3cc);
                        *(uint *)(local_af0.ray + 0x3d0) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_af0.ray + 0x3d0)
                        ;
                        *(uint *)(local_af0.ray + 0x3d4) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_af0.ray + 0x3d4)
                        ;
                        *(uint *)(local_af0.ray + 0x3d8) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_af0.ray + 0x3d8)
                        ;
                        *(uint *)(local_af0.ray + 0x3dc) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_af0.ray + 0x3dc)
                        ;
                        *(uint *)(local_af0.ray + 0x3e0) =
                             (uint)(bVar73 & 1) * iVar60 |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x3e0);
                        *(uint *)(local_af0.ray + 0x3e4) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_af0.ray + 0x3e4)
                        ;
                        *(uint *)(local_af0.ray + 1000) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_af0.ray + 1000);
                        *(uint *)(local_af0.ray + 0x3ec) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_af0.ray + 0x3ec)
                        ;
                        *(uint *)(local_af0.ray + 0x3f0) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_af0.ray + 0x3f0)
                        ;
                        *(uint *)(local_af0.ray + 0x3f4) =
                             (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_af0.ray + 0x3f4)
                        ;
                        *(uint *)(local_af0.ray + 0x3f8) =
                             (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_af0.ray + 0x3f8)
                        ;
                        *(uint *)(local_af0.ray + 0x3fc) =
                             (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_af0.ray + 0x3fc)
                        ;
                        iVar3 = *(int *)(local_af0.hit + 0x104);
                        iVar4 = *(int *)(local_af0.hit + 0x108);
                        iVar1 = *(int *)(local_af0.hit + 0x10c);
                        iVar56 = *(int *)(local_af0.hit + 0x110);
                        iVar57 = *(int *)(local_af0.hit + 0x114);
                        iVar58 = *(int *)(local_af0.hit + 0x118);
                        iVar59 = *(int *)(local_af0.hit + 0x11c);
                        iVar60 = *(int *)(local_af0.hit + 0x120);
                        iVar61 = *(int *)(local_af0.hit + 0x124);
                        iVar62 = *(int *)(local_af0.hit + 0x128);
                        iVar63 = *(int *)(local_af0.hit + 300);
                        iVar64 = *(int *)(local_af0.hit + 0x130);
                        iVar65 = *(int *)(local_af0.hit + 0x134);
                        iVar66 = *(int *)(local_af0.hit + 0x138);
                        iVar67 = *(int *)(local_af0.hit + 0x13c);
                        bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                        bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                        bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                        bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                        bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                        bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                        bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                        bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                        bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                        bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                        bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                        bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                        bVar22 = SUB81(uVar78 >> 0xf,0);
                        *(uint *)(local_af0.ray + 0x400) =
                             (uint)(bVar74 & 1) * *(int *)(local_af0.hit + 0x100) |
                             (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x400);
                        *(uint *)(local_af0.ray + 0x404) =
                             (uint)bVar80 * iVar3 | (uint)!bVar80 * *(int *)(local_af0.ray + 0x404);
                        *(uint *)(local_af0.ray + 0x408) =
                             (uint)bVar10 * iVar4 | (uint)!bVar10 * *(int *)(local_af0.ray + 0x408);
                        *(uint *)(local_af0.ray + 0x40c) =
                             (uint)bVar11 * iVar1 | (uint)!bVar11 * *(int *)(local_af0.ray + 0x40c);
                        *(uint *)(local_af0.ray + 0x410) =
                             (uint)bVar12 * iVar56 | (uint)!bVar12 * *(int *)(local_af0.ray + 0x410)
                        ;
                        *(uint *)(local_af0.ray + 0x414) =
                             (uint)bVar13 * iVar57 | (uint)!bVar13 * *(int *)(local_af0.ray + 0x414)
                        ;
                        *(uint *)(local_af0.ray + 0x418) =
                             (uint)bVar14 * iVar58 | (uint)!bVar14 * *(int *)(local_af0.ray + 0x418)
                        ;
                        *(uint *)(local_af0.ray + 0x41c) =
                             (uint)bVar15 * iVar59 | (uint)!bVar15 * *(int *)(local_af0.ray + 0x41c)
                        ;
                        *(uint *)(local_af0.ray + 0x420) =
                             (uint)(bVar73 & 1) * iVar60 |
                             (uint)!(bool)(bVar73 & 1) * *(int *)(local_af0.ray + 0x420);
                        *(uint *)(local_af0.ray + 0x424) =
                             (uint)bVar16 * iVar61 | (uint)!bVar16 * *(int *)(local_af0.ray + 0x424)
                        ;
                        *(uint *)(local_af0.ray + 0x428) =
                             (uint)bVar17 * iVar62 | (uint)!bVar17 * *(int *)(local_af0.ray + 0x428)
                        ;
                        *(uint *)(local_af0.ray + 0x42c) =
                             (uint)bVar18 * iVar63 | (uint)!bVar18 * *(int *)(local_af0.ray + 0x42c)
                        ;
                        *(uint *)(local_af0.ray + 0x430) =
                             (uint)bVar19 * iVar64 | (uint)!bVar19 * *(int *)(local_af0.ray + 0x430)
                        ;
                        *(uint *)(local_af0.ray + 0x434) =
                             (uint)bVar20 * iVar65 | (uint)!bVar20 * *(int *)(local_af0.ray + 0x434)
                        ;
                        *(uint *)(local_af0.ray + 0x438) =
                             (uint)bVar21 * iVar66 | (uint)!bVar21 * *(int *)(local_af0.ray + 0x438)
                        ;
                        *(uint *)(local_af0.ray + 0x43c) =
                             (uint)bVar22 * iVar67 | (uint)!bVar22 * *(int *)(local_af0.ray + 0x43c)
                        ;
                        auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x140));
                        auVar168 = vmovdqu32_avx512f(auVar168);
                        *(undefined1 (*) [64])(local_af0.ray + 0x440) = auVar168;
                        auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x180));
                        auVar168 = vmovdqu32_avx512f(auVar168);
                        *(undefined1 (*) [64])(local_af0.ray + 0x480) = auVar168;
                        auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x1c0));
                        auVar168 = vmovdqa32_avx512f(auVar168);
                        *(undefined1 (*) [64])(local_af0.ray + 0x4c0) = auVar168;
                        auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x200));
                        auVar168 = vmovdqa32_avx512f(auVar168);
                        *(undefined1 (*) [64])(local_af0.ray + 0x500) = auVar168;
                        goto LAB_01a7fdc6;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar181;
                  }
                }
              }
            }
LAB_01a7fdc6:
            uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar238._4_4_ = uVar170;
            auVar238._0_4_ = uVar170;
            auVar238._8_4_ = uVar170;
            auVar238._12_4_ = uVar170;
            auVar238._16_4_ = uVar170;
            auVar238._20_4_ = uVar170;
            auVar238._24_4_ = uVar170;
            auVar238._28_4_ = uVar170;
            auVar168 = ZEXT3264(auVar238);
            auVar68._4_4_ = fStack_65c;
            auVar68._0_4_ = local_660;
            auVar68._8_4_ = fStack_658;
            auVar68._12_4_ = fStack_654;
            auVar68._16_4_ = fStack_650;
            auVar68._20_4_ = fStack_64c;
            auVar68._24_4_ = fStack_648;
            auVar68._28_4_ = fStack_644;
            uVar24 = vcmpps_avx512vl(auVar238,auVar68,0xd);
          }
          auVar164._0_4_ = (float)local_960._0_4_ + (float)local_680._0_4_;
          auVar164._4_4_ = (float)local_960._4_4_ + (float)local_680._4_4_;
          auVar164._8_4_ = fStack_958 + fStack_678;
          auVar164._12_4_ = fStack_954 + fStack_674;
          auVar164._16_4_ = fStack_950 + fStack_670;
          auVar164._20_4_ = fStack_94c + fStack_66c;
          auVar164._24_4_ = fStack_948 + fStack_668;
          auVar164._28_4_ = fStack_944 + fStack_664;
          uVar170 = auVar168._0_4_;
          auVar177._4_4_ = uVar170;
          auVar177._0_4_ = uVar170;
          auVar177._8_4_ = uVar170;
          auVar177._12_4_ = uVar170;
          auVar177._16_4_ = uVar170;
          auVar177._20_4_ = uVar170;
          auVar177._24_4_ = uVar170;
          auVar177._28_4_ = uVar170;
          uVar24 = vcmpps_avx512vl(auVar164,auVar177,2);
          auVar165._8_4_ = 2;
          auVar165._0_8_ = 0x200000002;
          auVar165._12_4_ = 2;
          auVar165._16_4_ = 2;
          auVar165._20_4_ = 2;
          auVar165._24_4_ = 2;
          auVar165._28_4_ = 2;
          auVar41._8_4_ = 3;
          auVar41._0_8_ = 0x300000003;
          auVar41._12_4_ = 3;
          auVar41._16_4_ = 3;
          auVar41._20_4_ = 3;
          auVar41._24_4_ = 3;
          auVar41._28_4_ = 3;
          auVar111 = vpblendmd_avx512vl(auVar165,auVar41);
          local_680._0_4_ = (uint)(bVar72 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar72 & 1) * 2;
          bVar80 = (bool)(bVar72 >> 1 & 1);
          local_680._4_4_ = (uint)bVar80 * auVar111._4_4_ | (uint)!bVar80 * 2;
          bVar80 = (bool)(bVar72 >> 2 & 1);
          fStack_678 = (float)((uint)bVar80 * auVar111._8_4_ | (uint)!bVar80 * 2);
          bVar80 = (bool)(bVar72 >> 3 & 1);
          fStack_674 = (float)((uint)bVar80 * auVar111._12_4_ | (uint)!bVar80 * 2);
          bVar80 = (bool)(bVar72 >> 4 & 1);
          fStack_670 = (float)((uint)bVar80 * auVar111._16_4_ | (uint)!bVar80 * 2);
          bVar80 = (bool)(bVar72 >> 5 & 1);
          fStack_66c = (float)((uint)bVar80 * auVar111._20_4_ | (uint)!bVar80 * 2);
          bVar80 = (bool)(bVar72 >> 6 & 1);
          fStack_668 = (float)((uint)bVar80 * auVar111._24_4_ | (uint)!bVar80 * 2);
          fStack_664 = (float)((uint)(bVar72 >> 7) * auVar111._28_4_ |
                              (uint)!(bool)(bVar72 >> 7) * 2);
          bVar71 = (byte)uVar26 & bVar71 & (byte)uVar24;
          uVar24 = vpcmpd_avx512vl(_local_680,local_620,2);
          local_6e0 = _local_600;
          local_660 = (float)local_960._0_4_ + (float)local_600._0_4_;
          fStack_65c = (float)local_960._4_4_ + (float)local_600._4_4_;
          fStack_658 = fStack_958 + fStack_5f8;
          fStack_654 = fStack_954 + fStack_5f4;
          fStack_650 = fStack_950 + fStack_5f0;
          fStack_64c = fStack_94c + fStack_5ec;
          fStack_648 = fStack_948 + fStack_5e8;
          fStack_644 = fStack_944 + fStack_5e4;
          auVar251 = ZEXT3264(local_a20);
          auVar256 = ZEXT3264(local_a40);
          auVar258 = ZEXT3264(local_a60);
          auVar248 = ZEXT3264(local_9c0);
          auVar243 = ZEXT3264(local_9e0);
          auVar250 = ZEXT3264(local_a00);
          auVar253 = ZEXT3264(local_a80);
          for (bVar77 = (byte)uVar24 & bVar71; bVar77 != 0;
              bVar77 = ~('\x01' << ((byte)iVar2 & 0x1f)) & bVar77 & (byte)uVar24) {
            auVar166._8_4_ = 0x7f800000;
            auVar166._0_8_ = 0x7f8000007f800000;
            auVar166._12_4_ = 0x7f800000;
            auVar166._16_4_ = 0x7f800000;
            auVar166._20_4_ = 0x7f800000;
            auVar166._24_4_ = 0x7f800000;
            auVar166._28_4_ = 0x7f800000;
            auVar111 = vblendmps_avx512vl(auVar166,local_6e0);
            auVar145._0_4_ =
                 (uint)(bVar77 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar77 & 1) * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 1 & 1);
            auVar145._4_4_ = (uint)bVar80 * auVar111._4_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 2 & 1);
            auVar145._8_4_ = (uint)bVar80 * auVar111._8_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 3 & 1);
            auVar145._12_4_ = (uint)bVar80 * auVar111._12_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 4 & 1);
            auVar145._16_4_ = (uint)bVar80 * auVar111._16_4_ | (uint)!bVar80 * 0x7f800000;
            bVar80 = (bool)(bVar77 >> 5 & 1);
            auVar145._20_4_ = (uint)bVar80 * auVar111._20_4_ | (uint)!bVar80 * 0x7f800000;
            auVar145._24_4_ =
                 (uint)(bVar77 >> 6) * auVar111._24_4_ | (uint)!(bool)(bVar77 >> 6) * 0x7f800000;
            auVar145._28_4_ = 0x7f800000;
            auVar111 = vshufps_avx(auVar145,auVar145,0xb1);
            auVar111 = vminps_avx(auVar145,auVar111);
            auVar100 = vshufpd_avx(auVar111,auVar111,5);
            auVar111 = vminps_avx(auVar111,auVar100);
            auVar100 = vpermpd_avx2(auVar111,0x4e);
            auVar111 = vminps_avx(auVar111,auVar100);
            uVar24 = vcmpps_avx512vl(auVar145,auVar111,0);
            bVar74 = (byte)uVar24 & bVar77;
            bVar72 = bVar77;
            if (bVar74 != 0) {
              bVar72 = bVar74;
            }
            iVar2 = 0;
            for (uVar83 = (uint)bVar72; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
              iVar2 = iVar2 + 1;
            }
            uVar83 = *(uint *)(local_500 + (uint)(iVar2 << 2));
            fVar154 = auVar86._0_4_;
            auVar87 = ZEXT416(*(uint *)(local_5e0 + (uint)(iVar2 << 2)));
            if ((float)local_9a0._0_4_ < 0.0) {
              local_ac0._0_16_ = ZEXT416(*(uint *)(local_5e0 + (uint)(iVar2 << 2)));
              auVar261 = ZEXT1664(auVar261._0_16_);
              fVar154 = sqrtf((float)local_9a0._0_4_);
              auVar253 = ZEXT3264(local_a80);
              auVar250 = ZEXT3264(local_a00);
              auVar243 = ZEXT3264(local_9e0);
              auVar248 = ZEXT3264(local_9c0);
              auVar258 = ZEXT3264(local_a60);
              auVar256 = ZEXT3264(local_a40);
              auVar251 = ZEXT3264(local_a20);
              auVar87 = local_ac0._0_16_;
            }
            auVar84 = vminps_avx(local_800._0_16_,local_840._0_16_);
            auVar88 = vmaxps_avx(local_800._0_16_,local_840._0_16_);
            auVar97 = vminps_avx(local_820._0_16_,local_860._0_16_);
            auVar89 = vminps_avx(auVar84,auVar97);
            auVar84 = vmaxps_avx(local_820._0_16_,local_860._0_16_);
            auVar97 = vmaxps_avx(auVar88,auVar84);
            auVar96._8_4_ = 0x7fffffff;
            auVar96._0_8_ = 0x7fffffff7fffffff;
            auVar96._12_4_ = 0x7fffffff;
            auVar88 = vandps_avx(auVar89,auVar96);
            auVar84 = vandps_avx(auVar97,auVar96);
            auVar88 = vmaxps_avx(auVar88,auVar84);
            auVar84 = vmovshdup_avx(auVar88);
            auVar84 = vmaxss_avx(auVar84,auVar88);
            auVar88 = vshufpd_avx(auVar88,auVar88,1);
            auVar88 = vmaxss_avx(auVar88,auVar84);
            fVar181 = auVar88._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar97,auVar97,0xff);
            auVar87 = vinsertps_avx(auVar87,ZEXT416(uVar83),0x10);
            auVar168 = ZEXT1664(auVar87);
            lVar79 = 5;
            do {
              do {
                bVar80 = lVar79 == 0;
                lVar79 = lVar79 + -1;
                if (bVar80) goto LAB_01a80a99;
                uVar170 = auVar168._0_4_;
                auVar159._4_4_ = uVar170;
                auVar159._0_4_ = uVar170;
                auVar159._8_4_ = uVar170;
                auVar159._12_4_ = uVar170;
                auVar88 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_990);
                auVar84 = auVar168._0_16_;
                auVar87 = vmovshdup_avx(auVar84);
                local_7a0._0_16_ = auVar87;
                fVar189 = 1.0 - auVar87._0_4_;
                auVar87 = vshufps_avx(auVar84,auVar84,0x55);
                fVar183 = auVar87._0_4_;
                auVar199._0_4_ = local_840._0_4_ * fVar183;
                fVar185 = auVar87._4_4_;
                auVar199._4_4_ = local_840._4_4_ * fVar185;
                fVar155 = auVar87._8_4_;
                auVar199._8_4_ = local_840._8_4_ * fVar155;
                fVar187 = auVar87._12_4_;
                auVar199._12_4_ = local_840._12_4_ * fVar187;
                _local_780 = ZEXT416((uint)fVar189);
                auVar219._4_4_ = fVar189;
                auVar219._0_4_ = fVar189;
                auVar219._8_4_ = fVar189;
                auVar219._12_4_ = fVar189;
                auVar87 = vfmadd231ps_fma(auVar199,auVar219,local_800._0_16_);
                auVar229._0_4_ = local_820._0_4_ * fVar183;
                auVar229._4_4_ = local_820._4_4_ * fVar185;
                auVar229._8_4_ = local_820._8_4_ * fVar155;
                auVar229._12_4_ = local_820._12_4_ * fVar187;
                auVar84 = vfmadd231ps_fma(auVar229,auVar219,local_840._0_16_);
                auVar235._0_4_ = fVar183 * (float)local_860._0_4_;
                auVar235._4_4_ = fVar185 * (float)local_860._4_4_;
                auVar235._8_4_ = fVar155 * fStack_858;
                auVar235._12_4_ = fVar187 * fStack_854;
                auVar97 = vfmadd231ps_fma(auVar235,auVar219,local_820._0_16_);
                auVar241._0_4_ = fVar183 * auVar84._0_4_;
                auVar241._4_4_ = fVar185 * auVar84._4_4_;
                auVar241._8_4_ = fVar155 * auVar84._8_4_;
                auVar241._12_4_ = fVar187 * auVar84._12_4_;
                auVar87 = vfmadd231ps_fma(auVar241,auVar219,auVar87);
                auVar200._0_4_ = fVar183 * auVar97._0_4_;
                auVar200._4_4_ = fVar185 * auVar97._4_4_;
                auVar200._8_4_ = fVar155 * auVar97._8_4_;
                auVar200._12_4_ = fVar187 * auVar97._12_4_;
                auVar84 = vfmadd231ps_fma(auVar200,auVar219,auVar84);
                auVar230._0_4_ = fVar183 * auVar84._0_4_;
                auVar230._4_4_ = fVar185 * auVar84._4_4_;
                auVar230._8_4_ = fVar155 * auVar84._8_4_;
                auVar230._12_4_ = fVar187 * auVar84._12_4_;
                auVar97 = vfmadd231ps_fma(auVar230,auVar87,auVar219);
                auVar87 = vsubps_avx(auVar84,auVar87);
                auVar33._8_4_ = 0x40400000;
                auVar33._0_8_ = 0x4040000040400000;
                auVar33._12_4_ = 0x40400000;
                auVar84 = vmulps_avx512vl(auVar87,auVar33);
                local_760._0_16_ = auVar97;
                auVar88 = vsubps_avx(auVar88,auVar97);
                auVar87 = vdpps_avx(auVar88,auVar88,0x7f);
                local_ac0._0_16_ = auVar87;
                local_8c0 = auVar168;
                if (auVar87._0_4_ < 0.0) {
                  auVar250._0_4_ = sqrtf(auVar87._0_4_);
                  auVar250._4_60_ = extraout_var_00;
                  auVar87 = auVar250._0_16_;
                }
                else {
                  auVar87 = vsqrtss_avx(auVar87,auVar87);
                }
                local_7c0._0_16_ = vdpps_avx(auVar84,auVar84,0x7f);
                fVar183 = local_7c0._0_4_;
                auVar201._4_12_ = ZEXT812(0) << 0x20;
                auVar201._0_4_ = fVar183;
                local_980._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar201);
                fVar185 = local_980._0_4_;
                local_7e0._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar201);
                auVar34._8_4_ = 0x80000000;
                auVar34._0_8_ = 0x8000000080000000;
                auVar34._12_4_ = 0x80000000;
                auVar89 = vxorps_avx512vl(local_7c0._0_16_,auVar34);
                auVar97 = vfnmadd213ss_fma(local_7e0._0_16_,local_7c0._0_16_,ZEXT416(0x40000000));
                local_940._0_4_ = auVar97._0_4_;
                local_880._0_4_ = auVar87._0_4_;
                if (fVar183 < auVar89._0_4_) {
                  fVar155 = sqrtf(fVar183);
                  auVar87 = ZEXT416((uint)local_880._0_4_);
                }
                else {
                  auVar97 = vsqrtss_avx(local_7c0._0_16_,local_7c0._0_16_);
                  fVar155 = auVar97._0_4_;
                }
                fVar187 = local_980._0_4_;
                auVar85 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(fVar185 * 1.5 +
                                                   fVar183 * -0.5 * fVar187 * fVar187 * fVar187)));
                auVar89 = vmulps_avx512vl(auVar84,auVar85);
                local_980._0_16_ = vdpps_avx(auVar89,auVar88,0x7f);
                auVar91 = vaddss_avx512f(auVar87,ZEXT416(0x3f800000));
                auVar160._0_4_ = local_980._0_4_ * local_980._0_4_;
                auVar160._4_4_ = local_980._4_4_ * local_980._4_4_;
                auVar160._8_4_ = local_980._8_4_ * local_980._8_4_;
                auVar160._12_4_ = local_980._12_4_ * local_980._12_4_;
                auVar97 = vsubps_avx(local_ac0._0_16_,auVar160);
                fVar183 = auVar97._0_4_;
                auVar174._4_12_ = ZEXT812(0) << 0x20;
                auVar174._0_4_ = fVar183;
                auVar90 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
                auVar93 = vmulss_avx512f(auVar90,ZEXT416(0x3fc00000));
                auVar94 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
                uVar82 = fVar183 == 0.0;
                uVar81 = fVar183 < 0.0;
                if ((bool)uVar81) {
                  local_8e0._0_4_ = auVar93._0_4_;
                  _local_900 = auVar85;
                  local_8f0 = auVar89;
                  local_8d0 = auVar90;
                  fVar183 = sqrtf(fVar183);
                  auVar94 = ZEXT416(auVar94._0_4_);
                  auVar93 = ZEXT416((uint)local_8e0._0_4_);
                  auVar87 = ZEXT416((uint)local_880._0_4_);
                  auVar91 = ZEXT416(auVar91._0_4_);
                  auVar89 = local_8f0;
                  auVar90 = local_8d0;
                  auVar85 = _local_900;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar97,auVar97);
                  fVar183 = auVar97._0_4_;
                }
                auVar261 = ZEXT1664(auVar84);
                auVar251 = ZEXT3264(local_a20);
                auVar256 = ZEXT3264(local_a40);
                auVar258 = ZEXT3264(local_a60);
                auVar253 = ZEXT3264(local_a80);
                auVar92 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_780,local_7a0._0_16_
                                         );
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7a0._0_16_,_local_780
                                         );
                fVar185 = auVar97._0_4_ * 6.0;
                fVar187 = local_7a0._0_4_ * 6.0;
                auVar220._0_4_ = fVar187 * (float)local_860._0_4_;
                auVar220._4_4_ = fVar187 * (float)local_860._4_4_;
                auVar220._8_4_ = fVar187 * fStack_858;
                auVar220._12_4_ = fVar187 * fStack_854;
                auVar202._4_4_ = fVar185;
                auVar202._0_4_ = fVar185;
                auVar202._8_4_ = fVar185;
                auVar202._12_4_ = fVar185;
                auVar97 = vfmadd132ps_fma(auVar202,auVar220,local_820._0_16_);
                fVar185 = auVar92._0_4_ * 6.0;
                auVar175._4_4_ = fVar185;
                auVar175._0_4_ = fVar185;
                auVar175._8_4_ = fVar185;
                auVar175._12_4_ = fVar185;
                auVar97 = vfmadd132ps_fma(auVar175,auVar97,local_840._0_16_);
                fVar185 = local_780._0_4_ * 6.0;
                auVar203._4_4_ = fVar185;
                auVar203._0_4_ = fVar185;
                auVar203._8_4_ = fVar185;
                auVar203._12_4_ = fVar185;
                auVar97 = vfmadd132ps_fma(auVar203,auVar97,local_800._0_16_);
                auVar176._0_4_ = auVar97._0_4_ * (float)local_7c0._0_4_;
                auVar176._4_4_ = auVar97._4_4_ * (float)local_7c0._0_4_;
                auVar176._8_4_ = auVar97._8_4_ * (float)local_7c0._0_4_;
                auVar176._12_4_ = auVar97._12_4_ * (float)local_7c0._0_4_;
                auVar97 = vdpps_avx(auVar84,auVar97,0x7f);
                fVar185 = auVar97._0_4_;
                auVar204._0_4_ = auVar84._0_4_ * fVar185;
                auVar204._4_4_ = auVar84._4_4_ * fVar185;
                auVar204._8_4_ = auVar84._8_4_ * fVar185;
                auVar204._12_4_ = auVar84._12_4_ * fVar185;
                auVar97 = vsubps_avx(auVar176,auVar204);
                fVar185 = (float)local_940._0_4_ * (float)local_7e0._0_4_;
                auVar92 = vmaxss_avx(ZEXT416((uint)fVar181),
                                     ZEXT416((uint)(local_8c0._0_4_ * fVar154 * 1.9073486e-06)));
                auVar205._0_4_ = auVar97._0_4_ * fVar185;
                auVar205._4_4_ = auVar97._4_4_ * fVar185;
                auVar205._8_4_ = auVar97._8_4_ * fVar185;
                auVar205._12_4_ = auVar97._12_4_ * fVar185;
                auVar35._8_4_ = 0x80000000;
                auVar35._0_8_ = 0x8000000080000000;
                auVar35._12_4_ = 0x80000000;
                auVar95 = vxorps_avx512vl(auVar84,auVar35);
                auVar96 = vmulps_avx512vl(auVar85,auVar205);
                auVar97 = vdpps_avx(auVar95,auVar89,0x7f);
                auVar85 = vfmadd213ss_fma(auVar87,ZEXT416((uint)fVar181),auVar92);
                auVar87 = vdpps_avx(auVar88,auVar96,0x7f);
                vfmadd213ss_avx512f(auVar91,ZEXT416((uint)(fVar181 / fVar155)),auVar85);
                fVar185 = auVar97._0_4_ + auVar87._0_4_;
                auVar87 = vdpps_avx(local_990,auVar89,0x7f);
                auVar97 = vdpps_avx(auVar88,auVar95,0x7f);
                auVar89 = vmulss_avx512f(auVar94,auVar90);
                auVar85 = vmulss_avx512f(auVar90,auVar90);
                auVar90 = vaddss_avx512f(auVar93,ZEXT416((uint)(auVar89._0_4_ * auVar85._0_4_)));
                auVar89 = vdpps_avx(auVar88,local_990,0x7f);
                auVar91 = vfnmadd231ss_avx512f(auVar97,local_980._0_16_,ZEXT416((uint)fVar185));
                auVar89 = vfnmadd231ss_avx512f(auVar89,local_980._0_16_,auVar87);
                auVar97 = vpermilps_avx(local_760._0_16_,0xff);
                fVar183 = fVar183 - auVar97._0_4_;
                auVar85 = vshufps_avx(auVar84,auVar84,0xff);
                auVar97 = vfmsub213ss_fma(auVar91,auVar90,auVar85);
                auVar245._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = auVar97._8_4_ ^ 0x80000000;
                auVar245._12_4_ = auVar97._12_4_ ^ 0x80000000;
                auVar89 = ZEXT416((uint)(auVar89._0_4_ * auVar90._0_4_));
                auVar90 = vfmsub231ss_fma(ZEXT416((uint)(auVar87._0_4_ * auVar97._0_4_)),
                                          ZEXT416((uint)fVar185),auVar89);
                auVar97 = vinsertps_avx(auVar245,auVar89,0x1c);
                auVar236._0_8_ = auVar87._0_8_ ^ 0x8000000080000000;
                auVar236._8_4_ = auVar87._8_4_ ^ 0x80000000;
                auVar236._12_4_ = auVar87._12_4_ ^ 0x80000000;
                auVar89 = vinsertps_avx(ZEXT416((uint)fVar185),auVar236,0x10);
                auVar221._0_4_ = auVar90._0_4_;
                auVar221._4_4_ = auVar221._0_4_;
                auVar221._8_4_ = auVar221._0_4_;
                auVar221._12_4_ = auVar221._0_4_;
                auVar87 = vdivps_avx(auVar97,auVar221);
                auVar97 = vdivps_avx(auVar89,auVar221);
                auVar89 = vbroadcastss_avx512vl(local_980._0_16_);
                auVar222._0_4_ = auVar89._0_4_ * auVar87._0_4_ + fVar183 * auVar97._0_4_;
                auVar222._4_4_ = auVar89._4_4_ * auVar87._4_4_ + fVar183 * auVar97._4_4_;
                auVar222._8_4_ = auVar89._8_4_ * auVar87._8_4_ + fVar183 * auVar97._8_4_;
                auVar222._12_4_ = auVar89._12_4_ * auVar87._12_4_ + fVar183 * auVar97._12_4_;
                auVar87 = vsubps_avx(local_8c0._0_16_,auVar222);
                auVar168 = ZEXT1664(auVar87);
                auVar36._8_4_ = 0x7fffffff;
                auVar36._0_8_ = 0x7fffffff7fffffff;
                auVar36._12_4_ = 0x7fffffff;
                auVar97 = vandps_avx512vl(local_980._0_16_,auVar36);
                auVar97 = vucomiss_avx512f(auVar97);
                auVar248 = ZEXT3264(local_9c0);
                auVar243 = ZEXT3264(local_9e0);
                auVar250 = ZEXT3264(local_a00);
              } while ((bool)uVar81 || (bool)uVar82);
              auVar97 = vaddss_avx512f(auVar92,auVar97);
              auVar97 = vfmadd231ss_fma(auVar97,local_910,ZEXT416(0x36000000));
              auVar37._8_4_ = 0x7fffffff;
              auVar37._0_8_ = 0x7fffffff7fffffff;
              auVar37._12_4_ = 0x7fffffff;
              auVar89 = vandps_avx512vl(ZEXT416((uint)fVar183),auVar37);
            } while (auVar97._0_4_ <= auVar89._0_4_);
            fVar154 = auVar87._0_4_ + (float)local_920._0_4_;
            if (fVar260 <= fVar154) {
              auVar97 = vucomiss_avx512f(ZEXT416((uint)fVar154));
              if (fVar260 <= fVar154) {
                auVar87 = vmovshdup_avx(auVar87);
                fVar181 = auVar87._0_4_;
                if ((0.0 <= fVar181) && (fVar181 <= 1.0)) {
                  auVar87 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_ac0._0_4_));
                  fVar183 = auVar87._0_4_;
                  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    fVar183 = fVar183 * 1.5 +
                              (float)local_ac0._0_4_ * -0.5 * fVar183 * fVar183 * fVar183;
                    local_b20 = auVar88._0_4_;
                    fStack_b1c = auVar88._4_4_;
                    fStack_b18 = auVar88._8_4_;
                    fStack_b14 = auVar88._12_4_;
                    auVar223._0_4_ = fVar183 * local_b20;
                    auVar223._4_4_ = fVar183 * fStack_b1c;
                    auVar223._8_4_ = fVar183 * fStack_b18;
                    auVar223._12_4_ = fVar183 * fStack_b14;
                    auVar85 = vfmadd213ps_fma(auVar85,auVar223,auVar84);
                    auVar87 = vshufps_avx(auVar223,auVar223,0xc9);
                    auVar88 = vshufps_avx(auVar84,auVar84,0xc9);
                    auVar224._0_4_ = auVar223._0_4_ * auVar88._0_4_;
                    auVar224._4_4_ = auVar223._4_4_ * auVar88._4_4_;
                    auVar224._8_4_ = auVar223._8_4_ * auVar88._8_4_;
                    auVar224._12_4_ = auVar223._12_4_ * auVar88._12_4_;
                    auVar89 = vfmsub231ps_fma(auVar224,auVar84,auVar87);
                    auVar87 = vshufps_avx(auVar89,auVar89,0xc9);
                    auVar88 = vshufps_avx(auVar85,auVar85,0xc9);
                    auVar89 = vshufps_avx(auVar89,auVar89,0xd2);
                    auVar161._0_4_ = auVar85._0_4_ * auVar89._0_4_;
                    auVar161._4_4_ = auVar85._4_4_ * auVar89._4_4_;
                    auVar161._8_4_ = auVar85._8_4_ * auVar89._8_4_;
                    auVar161._12_4_ = auVar85._12_4_ * auVar89._12_4_;
                    auVar87 = vfmsub231ps_fma(auVar161,auVar87,auVar88);
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x200) = fVar154;
                      uVar170 = vextractps_avx(auVar87,1);
                      *(undefined4 *)(ray + k * 4 + 0x300) = uVar170;
                      uVar170 = vextractps_avx(auVar87,2);
                      *(undefined4 *)(ray + k * 4 + 0x340) = uVar170;
                      *(int *)(ray + k * 4 + 0x380) = auVar87._0_4_;
                      *(float *)(ray + k * 4 + 0x3c0) = fVar181;
                      *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                      *(uint *)(ray + k * 4 + 0x440) = uVar6;
                      *(uint *)(ray + k * 4 + 0x480) = uVar5;
                      *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                    }
                    else {
                      pRVar9 = context->user;
                      auVar263 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar263,auVar168);
                      auVar168 = vpermps_avx512f(auVar263,ZEXT1664(auVar87));
                      auVar263 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar263,ZEXT1664(auVar87));
                      local_380 = vbroadcastss_avx512f(auVar87);
                      local_400[0] = (RTCHitN)auVar168[0];
                      local_400[1] = (RTCHitN)auVar168[1];
                      local_400[2] = (RTCHitN)auVar168[2];
                      local_400[3] = (RTCHitN)auVar168[3];
                      local_400[4] = (RTCHitN)auVar168[4];
                      local_400[5] = (RTCHitN)auVar168[5];
                      local_400[6] = (RTCHitN)auVar168[6];
                      local_400[7] = (RTCHitN)auVar168[7];
                      local_400[8] = (RTCHitN)auVar168[8];
                      local_400[9] = (RTCHitN)auVar168[9];
                      local_400[10] = (RTCHitN)auVar168[10];
                      local_400[0xb] = (RTCHitN)auVar168[0xb];
                      local_400[0xc] = (RTCHitN)auVar168[0xc];
                      local_400[0xd] = (RTCHitN)auVar168[0xd];
                      local_400[0xe] = (RTCHitN)auVar168[0xe];
                      local_400[0xf] = (RTCHitN)auVar168[0xf];
                      local_400[0x10] = (RTCHitN)auVar168[0x10];
                      local_400[0x11] = (RTCHitN)auVar168[0x11];
                      local_400[0x12] = (RTCHitN)auVar168[0x12];
                      local_400[0x13] = (RTCHitN)auVar168[0x13];
                      local_400[0x14] = (RTCHitN)auVar168[0x14];
                      local_400[0x15] = (RTCHitN)auVar168[0x15];
                      local_400[0x16] = (RTCHitN)auVar168[0x16];
                      local_400[0x17] = (RTCHitN)auVar168[0x17];
                      local_400[0x18] = (RTCHitN)auVar168[0x18];
                      local_400[0x19] = (RTCHitN)auVar168[0x19];
                      local_400[0x1a] = (RTCHitN)auVar168[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar168[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar168[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar168[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar168[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar168[0x1f];
                      local_400[0x20] = (RTCHitN)auVar168[0x20];
                      local_400[0x21] = (RTCHitN)auVar168[0x21];
                      local_400[0x22] = (RTCHitN)auVar168[0x22];
                      local_400[0x23] = (RTCHitN)auVar168[0x23];
                      local_400[0x24] = (RTCHitN)auVar168[0x24];
                      local_400[0x25] = (RTCHitN)auVar168[0x25];
                      local_400[0x26] = (RTCHitN)auVar168[0x26];
                      local_400[0x27] = (RTCHitN)auVar168[0x27];
                      local_400[0x28] = (RTCHitN)auVar168[0x28];
                      local_400[0x29] = (RTCHitN)auVar168[0x29];
                      local_400[0x2a] = (RTCHitN)auVar168[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar168[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar168[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar168[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar168[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar168[0x2f];
                      local_400[0x30] = (RTCHitN)auVar168[0x30];
                      local_400[0x31] = (RTCHitN)auVar168[0x31];
                      local_400[0x32] = (RTCHitN)auVar168[0x32];
                      local_400[0x33] = (RTCHitN)auVar168[0x33];
                      local_400[0x34] = (RTCHitN)auVar168[0x34];
                      local_400[0x35] = (RTCHitN)auVar168[0x35];
                      local_400[0x36] = (RTCHitN)auVar168[0x36];
                      local_400[0x37] = (RTCHitN)auVar168[0x37];
                      local_400[0x38] = (RTCHitN)auVar168[0x38];
                      local_400[0x39] = (RTCHitN)auVar168[0x39];
                      local_400[0x3a] = (RTCHitN)auVar168[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar168[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar168[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar168[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar168[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar168[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar168 = vmovdqa64_avx512f(local_440);
                      local_280 = vmovdqa64_avx512f(auVar168);
                      auVar111 = vpcmpeqd_avx2(auVar168._0_32_,auVar168._0_32_);
                      local_a98[3] = auVar111;
                      local_a98[2] = auVar111;
                      local_a98[1] = auVar111;
                      *local_a98 = auVar111;
                      local_240 = vbroadcastss_avx512f(ZEXT416(pRVar9->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(pRVar9->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar154;
                      auVar168 = vmovdqa64_avx512f(local_4c0);
                      local_6c0 = vmovdqa64_avx512f(auVar168);
                      local_af0.valid = (int *)local_6c0;
                      local_af0.geometryUserPtr = pGVar7->userPtr;
                      local_af0.context = context->user;
                      local_af0.hit = local_400;
                      local_af0.N = 0x10;
                      local_8c0._0_4_ = auVar97._0_4_;
                      local_af0.ray = (RTCRayN *)ray;
                      uVar170 = auVar97._0_4_;
                      if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar261 = ZEXT1664(auVar84);
                        (*pGVar7->intersectionFilterN)(&local_af0);
                        auVar253 = ZEXT3264(local_a80);
                        auVar250 = ZEXT3264(local_a00);
                        auVar243 = ZEXT3264(local_9e0);
                        auVar248 = ZEXT3264(local_9c0);
                        auVar258 = ZEXT3264(local_a60);
                        auVar256 = ZEXT3264(local_a40);
                        auVar251 = ZEXT3264(local_a20);
                        auVar168 = vmovdqa64_avx512f(local_6c0);
                        uVar170 = local_8c0._0_4_;
                      }
                      uVar24 = vptestmd_avx512f(auVar168,auVar168);
                      if ((short)uVar24 != 0) {
                        p_Var8 = context->args->filter;
                        if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar261 = ZEXT1664(auVar261._0_16_);
                          (*p_Var8)(&local_af0);
                          auVar253 = ZEXT3264(local_a80);
                          auVar250 = ZEXT3264(local_a00);
                          auVar243 = ZEXT3264(local_9e0);
                          auVar248 = ZEXT3264(local_9c0);
                          auVar258 = ZEXT3264(local_a60);
                          auVar256 = ZEXT3264(local_a40);
                          auVar251 = ZEXT3264(local_a20);
                          auVar168 = vmovdqa64_avx512f(local_6c0);
                          uVar170 = local_8c0._0_4_;
                        }
                        uVar78 = vptestmd_avx512f(auVar168,auVar168);
                        if ((short)uVar78 != 0) {
                          iVar3 = *(int *)(local_af0.hit + 4);
                          iVar4 = *(int *)(local_af0.hit + 8);
                          iVar1 = *(int *)(local_af0.hit + 0xc);
                          iVar56 = *(int *)(local_af0.hit + 0x10);
                          iVar57 = *(int *)(local_af0.hit + 0x14);
                          iVar58 = *(int *)(local_af0.hit + 0x18);
                          iVar59 = *(int *)(local_af0.hit + 0x1c);
                          iVar60 = *(int *)(local_af0.hit + 0x20);
                          iVar61 = *(int *)(local_af0.hit + 0x24);
                          iVar62 = *(int *)(local_af0.hit + 0x28);
                          iVar63 = *(int *)(local_af0.hit + 0x2c);
                          iVar64 = *(int *)(local_af0.hit + 0x30);
                          iVar65 = *(int *)(local_af0.hit + 0x34);
                          iVar66 = *(int *)(local_af0.hit + 0x38);
                          iVar67 = *(int *)(local_af0.hit + 0x3c);
                          bVar72 = (byte)uVar78;
                          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                          bVar74 = (byte)(uVar78 >> 8);
                          bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                          bVar22 = SUB81(uVar78 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x300) =
                               (uint)(bVar72 & 1) * *(int *)local_af0.hit |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_af0.ray + 0x300);
                          *(uint *)(local_af0.ray + 0x304) =
                               (uint)bVar80 * iVar3 |
                               (uint)!bVar80 * *(int *)(local_af0.ray + 0x304);
                          *(uint *)(local_af0.ray + 0x308) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_af0.ray + 0x308);
                          *(uint *)(local_af0.ray + 0x30c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x30c);
                          *(uint *)(local_af0.ray + 0x310) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x310);
                          *(uint *)(local_af0.ray + 0x314) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x314);
                          *(uint *)(local_af0.ray + 0x318) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x318);
                          *(uint *)(local_af0.ray + 0x31c) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x31c);
                          *(uint *)(local_af0.ray + 800) =
                               (uint)(bVar74 & 1) * iVar60 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 800);
                          *(uint *)(local_af0.ray + 0x324) =
                               (uint)bVar16 * iVar61 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x324);
                          *(uint *)(local_af0.ray + 0x328) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x328);
                          *(uint *)(local_af0.ray + 0x32c) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x32c);
                          *(uint *)(local_af0.ray + 0x330) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x330);
                          *(uint *)(local_af0.ray + 0x334) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x334);
                          *(uint *)(local_af0.ray + 0x338) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x338);
                          *(uint *)(local_af0.ray + 0x33c) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x33c);
                          iVar3 = *(int *)(local_af0.hit + 0x44);
                          iVar4 = *(int *)(local_af0.hit + 0x48);
                          iVar1 = *(int *)(local_af0.hit + 0x4c);
                          iVar56 = *(int *)(local_af0.hit + 0x50);
                          iVar57 = *(int *)(local_af0.hit + 0x54);
                          iVar58 = *(int *)(local_af0.hit + 0x58);
                          iVar59 = *(int *)(local_af0.hit + 0x5c);
                          iVar60 = *(int *)(local_af0.hit + 0x60);
                          iVar61 = *(int *)(local_af0.hit + 100);
                          iVar62 = *(int *)(local_af0.hit + 0x68);
                          iVar63 = *(int *)(local_af0.hit + 0x6c);
                          iVar64 = *(int *)(local_af0.hit + 0x70);
                          iVar65 = *(int *)(local_af0.hit + 0x74);
                          iVar66 = *(int *)(local_af0.hit + 0x78);
                          iVar67 = *(int *)(local_af0.hit + 0x7c);
                          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                          bVar22 = SUB81(uVar78 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x340) =
                               (uint)(bVar72 & 1) * *(int *)(local_af0.hit + 0x40) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_af0.ray + 0x340);
                          *(uint *)(local_af0.ray + 0x344) =
                               (uint)bVar80 * iVar3 |
                               (uint)!bVar80 * *(int *)(local_af0.ray + 0x344);
                          *(uint *)(local_af0.ray + 0x348) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_af0.ray + 0x348);
                          *(uint *)(local_af0.ray + 0x34c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x34c);
                          *(uint *)(local_af0.ray + 0x350) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x350);
                          *(uint *)(local_af0.ray + 0x354) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x354);
                          *(uint *)(local_af0.ray + 0x358) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x358);
                          *(uint *)(local_af0.ray + 0x35c) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x35c);
                          *(uint *)(local_af0.ray + 0x360) =
                               (uint)(bVar74 & 1) * iVar60 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x360);
                          *(uint *)(local_af0.ray + 0x364) =
                               (uint)bVar16 * iVar61 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x364);
                          *(uint *)(local_af0.ray + 0x368) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x368);
                          *(uint *)(local_af0.ray + 0x36c) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x36c);
                          *(uint *)(local_af0.ray + 0x370) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x370);
                          *(uint *)(local_af0.ray + 0x374) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x374);
                          *(uint *)(local_af0.ray + 0x378) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x378);
                          *(uint *)(local_af0.ray + 0x37c) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x37c);
                          iVar3 = *(int *)(local_af0.hit + 0x84);
                          iVar4 = *(int *)(local_af0.hit + 0x88);
                          iVar1 = *(int *)(local_af0.hit + 0x8c);
                          iVar56 = *(int *)(local_af0.hit + 0x90);
                          iVar57 = *(int *)(local_af0.hit + 0x94);
                          iVar58 = *(int *)(local_af0.hit + 0x98);
                          iVar59 = *(int *)(local_af0.hit + 0x9c);
                          iVar60 = *(int *)(local_af0.hit + 0xa0);
                          iVar61 = *(int *)(local_af0.hit + 0xa4);
                          iVar62 = *(int *)(local_af0.hit + 0xa8);
                          iVar63 = *(int *)(local_af0.hit + 0xac);
                          iVar64 = *(int *)(local_af0.hit + 0xb0);
                          iVar65 = *(int *)(local_af0.hit + 0xb4);
                          iVar66 = *(int *)(local_af0.hit + 0xb8);
                          iVar67 = *(int *)(local_af0.hit + 0xbc);
                          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                          bVar22 = SUB81(uVar78 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x380) =
                               (uint)(bVar72 & 1) * *(int *)(local_af0.hit + 0x80) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_af0.ray + 0x380);
                          *(uint *)(local_af0.ray + 900) =
                               (uint)bVar80 * iVar3 | (uint)!bVar80 * *(int *)(local_af0.ray + 900);
                          *(uint *)(local_af0.ray + 0x388) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_af0.ray + 0x388);
                          *(uint *)(local_af0.ray + 0x38c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x38c);
                          *(uint *)(local_af0.ray + 0x390) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x390);
                          *(uint *)(local_af0.ray + 0x394) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x394);
                          *(uint *)(local_af0.ray + 0x398) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x398);
                          *(uint *)(local_af0.ray + 0x39c) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x39c);
                          *(uint *)(local_af0.ray + 0x3a0) =
                               (uint)(bVar74 & 1) * iVar60 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x3a0);
                          *(uint *)(local_af0.ray + 0x3a4) =
                               (uint)bVar16 * iVar61 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x3a4);
                          *(uint *)(local_af0.ray + 0x3a8) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x3a8);
                          *(uint *)(local_af0.ray + 0x3ac) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x3ac);
                          *(uint *)(local_af0.ray + 0x3b0) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x3b0);
                          *(uint *)(local_af0.ray + 0x3b4) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x3b4);
                          *(uint *)(local_af0.ray + 0x3b8) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x3b8);
                          *(uint *)(local_af0.ray + 0x3bc) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x3bc);
                          iVar3 = *(int *)(local_af0.hit + 0xc4);
                          iVar4 = *(int *)(local_af0.hit + 200);
                          iVar1 = *(int *)(local_af0.hit + 0xcc);
                          iVar56 = *(int *)(local_af0.hit + 0xd0);
                          iVar57 = *(int *)(local_af0.hit + 0xd4);
                          iVar58 = *(int *)(local_af0.hit + 0xd8);
                          iVar59 = *(int *)(local_af0.hit + 0xdc);
                          iVar60 = *(int *)(local_af0.hit + 0xe0);
                          iVar61 = *(int *)(local_af0.hit + 0xe4);
                          iVar62 = *(int *)(local_af0.hit + 0xe8);
                          iVar63 = *(int *)(local_af0.hit + 0xec);
                          iVar64 = *(int *)(local_af0.hit + 0xf0);
                          iVar65 = *(int *)(local_af0.hit + 0xf4);
                          iVar66 = *(int *)(local_af0.hit + 0xf8);
                          iVar67 = *(int *)(local_af0.hit + 0xfc);
                          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                          bVar22 = SUB81(uVar78 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x3c0) =
                               (uint)(bVar72 & 1) * *(int *)(local_af0.hit + 0xc0) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_af0.ray + 0x3c0);
                          *(uint *)(local_af0.ray + 0x3c4) =
                               (uint)bVar80 * iVar3 |
                               (uint)!bVar80 * *(int *)(local_af0.ray + 0x3c4);
                          *(uint *)(local_af0.ray + 0x3c8) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_af0.ray + 0x3c8);
                          *(uint *)(local_af0.ray + 0x3cc) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x3cc);
                          *(uint *)(local_af0.ray + 0x3d0) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x3d0);
                          *(uint *)(local_af0.ray + 0x3d4) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x3d4);
                          *(uint *)(local_af0.ray + 0x3d8) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x3d8);
                          *(uint *)(local_af0.ray + 0x3dc) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x3dc);
                          *(uint *)(local_af0.ray + 0x3e0) =
                               (uint)(bVar74 & 1) * iVar60 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x3e0);
                          *(uint *)(local_af0.ray + 0x3e4) =
                               (uint)bVar16 * iVar61 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x3e4);
                          *(uint *)(local_af0.ray + 1000) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 1000);
                          *(uint *)(local_af0.ray + 0x3ec) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x3ec);
                          *(uint *)(local_af0.ray + 0x3f0) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x3f0);
                          *(uint *)(local_af0.ray + 0x3f4) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x3f4);
                          *(uint *)(local_af0.ray + 0x3f8) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x3f8);
                          *(uint *)(local_af0.ray + 0x3fc) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x3fc);
                          iVar3 = *(int *)(local_af0.hit + 0x104);
                          iVar4 = *(int *)(local_af0.hit + 0x108);
                          iVar1 = *(int *)(local_af0.hit + 0x10c);
                          iVar56 = *(int *)(local_af0.hit + 0x110);
                          iVar57 = *(int *)(local_af0.hit + 0x114);
                          iVar58 = *(int *)(local_af0.hit + 0x118);
                          iVar59 = *(int *)(local_af0.hit + 0x11c);
                          iVar60 = *(int *)(local_af0.hit + 0x120);
                          iVar61 = *(int *)(local_af0.hit + 0x124);
                          iVar62 = *(int *)(local_af0.hit + 0x128);
                          iVar63 = *(int *)(local_af0.hit + 300);
                          iVar64 = *(int *)(local_af0.hit + 0x130);
                          iVar65 = *(int *)(local_af0.hit + 0x134);
                          iVar66 = *(int *)(local_af0.hit + 0x138);
                          iVar67 = *(int *)(local_af0.hit + 0x13c);
                          bVar80 = (bool)((byte)(uVar78 >> 1) & 1);
                          bVar10 = (bool)((byte)(uVar78 >> 2) & 1);
                          bVar11 = (bool)((byte)(uVar78 >> 3) & 1);
                          bVar12 = (bool)((byte)(uVar78 >> 4) & 1);
                          bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                          bVar14 = (bool)((byte)(uVar78 >> 6) & 1);
                          bVar15 = (bool)((byte)(uVar78 >> 7) & 1);
                          bVar16 = (bool)((byte)(uVar78 >> 9) & 1);
                          bVar17 = (bool)((byte)(uVar78 >> 10) & 1);
                          bVar18 = (bool)((byte)(uVar78 >> 0xb) & 1);
                          bVar19 = (bool)((byte)(uVar78 >> 0xc) & 1);
                          bVar20 = (bool)((byte)(uVar78 >> 0xd) & 1);
                          bVar21 = (bool)((byte)(uVar78 >> 0xe) & 1);
                          bVar22 = SUB81(uVar78 >> 0xf,0);
                          *(uint *)(local_af0.ray + 0x400) =
                               (uint)(bVar72 & 1) * *(int *)(local_af0.hit + 0x100) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_af0.ray + 0x400);
                          *(uint *)(local_af0.ray + 0x404) =
                               (uint)bVar80 * iVar3 |
                               (uint)!bVar80 * *(int *)(local_af0.ray + 0x404);
                          *(uint *)(local_af0.ray + 0x408) =
                               (uint)bVar10 * iVar4 |
                               (uint)!bVar10 * *(int *)(local_af0.ray + 0x408);
                          *(uint *)(local_af0.ray + 0x40c) =
                               (uint)bVar11 * iVar1 |
                               (uint)!bVar11 * *(int *)(local_af0.ray + 0x40c);
                          *(uint *)(local_af0.ray + 0x410) =
                               (uint)bVar12 * iVar56 |
                               (uint)!bVar12 * *(int *)(local_af0.ray + 0x410);
                          *(uint *)(local_af0.ray + 0x414) =
                               (uint)bVar13 * iVar57 |
                               (uint)!bVar13 * *(int *)(local_af0.ray + 0x414);
                          *(uint *)(local_af0.ray + 0x418) =
                               (uint)bVar14 * iVar58 |
                               (uint)!bVar14 * *(int *)(local_af0.ray + 0x418);
                          *(uint *)(local_af0.ray + 0x41c) =
                               (uint)bVar15 * iVar59 |
                               (uint)!bVar15 * *(int *)(local_af0.ray + 0x41c);
                          *(uint *)(local_af0.ray + 0x420) =
                               (uint)(bVar74 & 1) * iVar60 |
                               (uint)!(bool)(bVar74 & 1) * *(int *)(local_af0.ray + 0x420);
                          *(uint *)(local_af0.ray + 0x424) =
                               (uint)bVar16 * iVar61 |
                               (uint)!bVar16 * *(int *)(local_af0.ray + 0x424);
                          *(uint *)(local_af0.ray + 0x428) =
                               (uint)bVar17 * iVar62 |
                               (uint)!bVar17 * *(int *)(local_af0.ray + 0x428);
                          *(uint *)(local_af0.ray + 0x42c) =
                               (uint)bVar18 * iVar63 |
                               (uint)!bVar18 * *(int *)(local_af0.ray + 0x42c);
                          *(uint *)(local_af0.ray + 0x430) =
                               (uint)bVar19 * iVar64 |
                               (uint)!bVar19 * *(int *)(local_af0.ray + 0x430);
                          *(uint *)(local_af0.ray + 0x434) =
                               (uint)bVar20 * iVar65 |
                               (uint)!bVar20 * *(int *)(local_af0.ray + 0x434);
                          *(uint *)(local_af0.ray + 0x438) =
                               (uint)bVar21 * iVar66 |
                               (uint)!bVar21 * *(int *)(local_af0.ray + 0x438);
                          *(uint *)(local_af0.ray + 0x43c) =
                               (uint)bVar22 * iVar67 |
                               (uint)!bVar22 * *(int *)(local_af0.ray + 0x43c);
                          auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x140)
                                                      );
                          auVar168 = vmovdqu32_avx512f(auVar168);
                          *(undefined1 (*) [64])(local_af0.ray + 0x440) = auVar168;
                          auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x180)
                                                      );
                          auVar168 = vmovdqu32_avx512f(auVar168);
                          *(undefined1 (*) [64])(local_af0.ray + 0x480) = auVar168;
                          auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x1c0)
                                                      );
                          auVar168 = vmovdqa32_avx512f(auVar168);
                          *(undefined1 (*) [64])(local_af0.ray + 0x4c0) = auVar168;
                          auVar168 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_af0.hit + 0x200)
                                                      );
                          auVar168 = vmovdqa32_avx512f(auVar168);
                          *(undefined1 (*) [64])(local_af0.ray + 0x500) = auVar168;
                          goto LAB_01a80a99;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar170;
                    }
                  }
                }
              }
            }
LAB_01a80a99:
            uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar239._4_4_ = uVar170;
            auVar239._0_4_ = uVar170;
            auVar239._8_4_ = uVar170;
            auVar239._12_4_ = uVar170;
            auVar239._16_4_ = uVar170;
            auVar239._20_4_ = uVar170;
            auVar239._24_4_ = uVar170;
            auVar239._28_4_ = uVar170;
            auVar168 = ZEXT3264(auVar239);
            auVar69._4_4_ = fStack_65c;
            auVar69._0_4_ = local_660;
            auVar69._8_4_ = fStack_658;
            auVar69._12_4_ = fStack_654;
            auVar69._16_4_ = fStack_650;
            auVar69._20_4_ = fStack_64c;
            auVar69._24_4_ = fStack_648;
            auVar69._28_4_ = fStack_644;
            uVar24 = vcmpps_avx512vl(auVar239,auVar69,0xd);
          }
          uVar27 = vpcmpd_avx512vl(local_620,local_5c0,1);
          uVar26 = vpcmpd_avx512vl(local_620,_local_680,1);
          auVar178._0_4_ = (float)local_960._0_4_ + (float)local_540._0_4_;
          auVar178._4_4_ = (float)local_960._4_4_ + (float)local_540._4_4_;
          auVar178._8_4_ = fStack_958 + fStack_538;
          auVar178._12_4_ = fStack_954 + fStack_534;
          auVar178._16_4_ = fStack_950 + fStack_530;
          auVar178._20_4_ = fStack_94c + fStack_52c;
          auVar178._24_4_ = fStack_948 + fStack_528;
          auVar178._28_4_ = fStack_944 + fStack_524;
          uVar170 = auVar168._0_4_;
          auVar209._4_4_ = uVar170;
          auVar209._0_4_ = uVar170;
          auVar209._8_4_ = uVar170;
          auVar209._12_4_ = uVar170;
          auVar209._16_4_ = uVar170;
          auVar209._20_4_ = uVar170;
          auVar209._24_4_ = uVar170;
          auVar209._28_4_ = uVar170;
          uVar24 = vcmpps_avx512vl(auVar178,auVar209,2);
          bVar75 = bVar75 & (byte)uVar27 & (byte)uVar24;
          auVar226._0_4_ = (float)local_960._0_4_ + (float)local_600._0_4_;
          auVar226._4_4_ = (float)local_960._4_4_ + (float)local_600._4_4_;
          auVar226._8_4_ = fStack_958 + fStack_5f8;
          auVar226._12_4_ = fStack_954 + fStack_5f4;
          auVar226._16_4_ = fStack_950 + fStack_5f0;
          auVar226._20_4_ = fStack_94c + fStack_5ec;
          auVar226._24_4_ = fStack_948 + fStack_5e8;
          auVar226._28_4_ = fStack_944 + fStack_5e4;
          uVar24 = vcmpps_avx512vl(auVar226,auVar209,2);
          bVar71 = bVar71 & (byte)uVar26 & (byte)uVar24 | bVar75;
          if (bVar71 != 0) {
            abStack_1a0[uVar76 * 0x60] = bVar71;
            bVar80 = (bool)(bVar75 >> 1 & 1);
            bVar10 = (bool)(bVar75 >> 2 & 1);
            bVar11 = (bool)(bVar75 >> 3 & 1);
            bVar12 = (bool)(bVar75 >> 4 & 1);
            bVar13 = (bool)(bVar75 >> 5 & 1);
            auStack_180[uVar76 * 0x18] =
                 (uint)(bVar75 & 1) * local_540._0_4_ | (uint)!(bool)(bVar75 & 1) * local_600._0_4_;
            auStack_180[uVar76 * 0x18 + 1] =
                 (uint)bVar80 * local_540._4_4_ | (uint)!bVar80 * local_600._4_4_;
            auStack_180[uVar76 * 0x18 + 2] =
                 (uint)bVar10 * (int)fStack_538 | (uint)!bVar10 * (int)fStack_5f8;
            auStack_180[uVar76 * 0x18 + 3] =
                 (uint)bVar11 * (int)fStack_534 | (uint)!bVar11 * (int)fStack_5f4;
            auStack_180[uVar76 * 0x18 + 4] =
                 (uint)bVar12 * (int)fStack_530 | (uint)!bVar12 * (int)fStack_5f0;
            auStack_180[uVar76 * 0x18 + 5] =
                 (uint)bVar13 * (int)fStack_52c | (uint)!bVar13 * (int)fStack_5ec;
            auStack_180[uVar76 * 0x18 + 6] =
                 (uint)(bVar75 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar75 >> 6) * (int)fStack_5e8;
            (&fStack_164)[uVar76 * 0x18] = fStack_5e4;
            uVar78 = vmovlps_avx(local_630);
            (&uStack_160)[uVar76 * 0xc] = uVar78;
            aiStack_158[uVar76 * 0x18] = local_cc8 + 1;
            uVar76 = (ulong)((int)uVar76 + 1);
          }
          auVar111 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar263 = ZEXT3264(auVar111);
          auVar168 = ZEXT3264(_DAT_01f7b040);
          prim = local_a90;
          fVar154 = (float)local_960._0_4_;
          fVar181 = (float)local_960._4_4_;
          fVar183 = fStack_958;
          fVar185 = fStack_954;
          fVar155 = fStack_950;
          fVar187 = fStack_94c;
          fVar189 = fStack_948;
          fVar211 = fStack_944;
        }
      }
    }
    do {
      uVar83 = (uint)uVar76;
      uVar76 = (ulong)(uVar83 - 1);
      if (uVar83 == 0) {
        uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar43._4_4_ = uVar170;
        auVar43._0_4_ = uVar170;
        auVar43._8_4_ = uVar170;
        auVar43._12_4_ = uVar170;
        auVar43._16_4_ = uVar170;
        auVar43._20_4_ = uVar170;
        auVar43._24_4_ = uVar170;
        auVar43._28_4_ = uVar170;
        uVar24 = vcmpps_avx512vl(local_5a0,auVar43,2);
        local_a88 = (ulong)((uint)local_a88 & (uint)uVar24);
        goto LAB_01a7e5a6;
      }
      auVar111 = *(undefined1 (*) [32])(auStack_180 + uVar76 * 0x18);
      auVar179._0_4_ = fVar154 + auVar111._0_4_;
      auVar179._4_4_ = fVar181 + auVar111._4_4_;
      auVar179._8_4_ = fVar183 + auVar111._8_4_;
      auVar179._12_4_ = fVar185 + auVar111._12_4_;
      auVar179._16_4_ = fVar155 + auVar111._16_4_;
      auVar179._20_4_ = fVar187 + auVar111._20_4_;
      auVar179._24_4_ = fVar189 + auVar111._24_4_;
      auVar179._28_4_ = fVar211 + auVar111._28_4_;
      uVar170 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar42._4_4_ = uVar170;
      auVar42._0_4_ = uVar170;
      auVar42._8_4_ = uVar170;
      auVar42._12_4_ = uVar170;
      auVar42._16_4_ = uVar170;
      auVar42._20_4_ = uVar170;
      auVar42._24_4_ = uVar170;
      auVar42._28_4_ = uVar170;
      uVar24 = vcmpps_avx512vl(auVar179,auVar42,2);
      uVar147 = (uint)uVar24 & (uint)abStack_1a0[uVar76 * 0x60];
    } while (uVar147 == 0);
    uVar78 = (&uStack_160)[uVar76 * 0xc];
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar78;
    auVar210._8_4_ = 0x7f800000;
    auVar210._0_8_ = 0x7f8000007f800000;
    auVar210._12_4_ = 0x7f800000;
    auVar210._16_4_ = 0x7f800000;
    auVar210._20_4_ = 0x7f800000;
    auVar210._24_4_ = 0x7f800000;
    auVar210._28_4_ = 0x7f800000;
    auVar100 = vblendmps_avx512vl(auVar210,auVar111);
    bVar71 = (byte)uVar147;
    auVar146._0_4_ =
         (uint)(bVar71 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar111._0_4_;
    bVar80 = (bool)((byte)(uVar147 >> 1) & 1);
    auVar146._4_4_ = (uint)bVar80 * auVar100._4_4_ | (uint)!bVar80 * (int)auVar111._4_4_;
    bVar80 = (bool)((byte)(uVar147 >> 2) & 1);
    auVar146._8_4_ = (uint)bVar80 * auVar100._8_4_ | (uint)!bVar80 * (int)auVar111._8_4_;
    bVar80 = (bool)((byte)(uVar147 >> 3) & 1);
    auVar146._12_4_ = (uint)bVar80 * auVar100._12_4_ | (uint)!bVar80 * (int)auVar111._12_4_;
    bVar80 = (bool)((byte)(uVar147 >> 4) & 1);
    auVar146._16_4_ = (uint)bVar80 * auVar100._16_4_ | (uint)!bVar80 * (int)auVar111._16_4_;
    bVar80 = (bool)((byte)(uVar147 >> 5) & 1);
    auVar146._20_4_ = (uint)bVar80 * auVar100._20_4_ | (uint)!bVar80 * (int)auVar111._20_4_;
    bVar80 = (bool)((byte)(uVar147 >> 6) & 1);
    auVar146._24_4_ = (uint)bVar80 * auVar100._24_4_ | (uint)!bVar80 * (int)auVar111._24_4_;
    auVar146._28_4_ =
         (uVar147 >> 7) * auVar100._28_4_ | (uint)!SUB41(uVar147 >> 7,0) * (int)auVar111._28_4_;
    auVar111 = vshufps_avx(auVar146,auVar146,0xb1);
    auVar111 = vminps_avx(auVar146,auVar111);
    auVar100 = vshufpd_avx(auVar111,auVar111,5);
    auVar111 = vminps_avx(auVar111,auVar100);
    auVar100 = vpermpd_avx2(auVar111,0x4e);
    auVar111 = vminps_avx(auVar111,auVar100);
    uVar24 = vcmpps_avx512vl(auVar146,auVar111,0);
    bVar77 = (byte)uVar24 & bVar71;
    if (bVar77 != 0) {
      uVar147 = (uint)bVar77;
    }
    uVar148 = 0;
    for (; (uVar147 & 1) == 0; uVar147 = uVar147 >> 1 | 0x80000000) {
      uVar148 = uVar148 + 1;
    }
    local_cc8 = aiStack_158[uVar76 * 0x18];
    bVar71 = ~('\x01' << ((byte)uVar148 & 0x1f)) & bVar71;
    abStack_1a0[uVar76 * 0x60] = bVar71;
    if (bVar71 == 0) {
      uVar83 = uVar83 - 1;
    }
    uVar170 = (undefined4)uVar78;
    auVar167._4_4_ = uVar170;
    auVar167._0_4_ = uVar170;
    auVar167._8_4_ = uVar170;
    auVar167._12_4_ = uVar170;
    auVar167._16_4_ = uVar170;
    auVar167._20_4_ = uVar170;
    auVar167._24_4_ = uVar170;
    auVar167._28_4_ = uVar170;
    auVar87 = vmovshdup_avx(auVar95);
    auVar87 = vsubps_avx(auVar87,auVar95);
    auVar180._0_4_ = auVar87._0_4_;
    auVar180._4_4_ = auVar180._0_4_;
    auVar180._8_4_ = auVar180._0_4_;
    auVar180._12_4_ = auVar180._0_4_;
    auVar180._16_4_ = auVar180._0_4_;
    auVar180._20_4_ = auVar180._0_4_;
    auVar180._24_4_ = auVar180._0_4_;
    auVar180._28_4_ = auVar180._0_4_;
    auVar87 = vfmadd132ps_fma(auVar180,auVar167,auVar168._0_32_);
    auVar111 = ZEXT1632(auVar87);
    local_400[0] = (RTCHitN)auVar111[0];
    local_400[1] = (RTCHitN)auVar111[1];
    local_400[2] = (RTCHitN)auVar111[2];
    local_400[3] = (RTCHitN)auVar111[3];
    local_400[4] = (RTCHitN)auVar111[4];
    local_400[5] = (RTCHitN)auVar111[5];
    local_400[6] = (RTCHitN)auVar111[6];
    local_400[7] = (RTCHitN)auVar111[7];
    local_400[8] = (RTCHitN)auVar111[8];
    local_400[9] = (RTCHitN)auVar111[9];
    local_400[10] = (RTCHitN)auVar111[10];
    local_400[0xb] = (RTCHitN)auVar111[0xb];
    local_400[0xc] = (RTCHitN)auVar111[0xc];
    local_400[0xd] = (RTCHitN)auVar111[0xd];
    local_400[0xe] = (RTCHitN)auVar111[0xe];
    local_400[0xf] = (RTCHitN)auVar111[0xf];
    local_400[0x10] = (RTCHitN)auVar111[0x10];
    local_400[0x11] = (RTCHitN)auVar111[0x11];
    local_400[0x12] = (RTCHitN)auVar111[0x12];
    local_400[0x13] = (RTCHitN)auVar111[0x13];
    local_400[0x14] = (RTCHitN)auVar111[0x14];
    local_400[0x15] = (RTCHitN)auVar111[0x15];
    local_400[0x16] = (RTCHitN)auVar111[0x16];
    local_400[0x17] = (RTCHitN)auVar111[0x17];
    local_400[0x18] = (RTCHitN)auVar111[0x18];
    local_400[0x19] = (RTCHitN)auVar111[0x19];
    local_400[0x1a] = (RTCHitN)auVar111[0x1a];
    local_400[0x1b] = (RTCHitN)auVar111[0x1b];
    local_400[0x1c] = (RTCHitN)auVar111[0x1c];
    local_400[0x1d] = (RTCHitN)auVar111[0x1d];
    local_400[0x1e] = (RTCHitN)auVar111[0x1e];
    local_400[0x1f] = (RTCHitN)auVar111[0x1f];
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_400 + (ulong)uVar148 * 4);
    uVar76 = (ulong)uVar83;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }